

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O1

MPP_RET vdpp2_params_to_reg(vdpp2_params *src_params,vdpp2_api_ctx *ctx)

{
  anon_struct_4_12_c7297a37_for_reg4 *paVar1;
  anon_struct_4_6_a16724de_for_reg8 *paVar2;
  anon_struct_4_17_f45c7487_for_reg1 aVar3;
  anon_struct_4_6_2c2caa47_for_reg14 aVar4;
  anon_struct_4_4_4045accf_for_reg15 aVar5;
  anon_struct_4_4_effd29bf_for_reg16 aVar6;
  anon_struct_4_3_89b91cde_for_reg2 aVar7;
  anon_struct_4_9_24a09030_for_reg3 aVar8;
  anon_struct_4_3_30fecd47_for_reg2 aVar9;
  anon_struct_4_4_7323fa83_for_reg14 aVar10;
  anon_struct_4_5_ac9e8c85_for_reg162 aVar11;
  anon_struct_4_5_051dd277_for_reg164 aVar12;
  anon_struct_4_5_e9729c4a_for_reg163 aVar13;
  anon_struct_4_5_dbe3e6bc_for_reg165 aVar14;
  anon_struct_4_5_7d0670dc_for_reg166 aVar15;
  anon_struct_4_5_ee4e9261_for_reg167 aVar16;
  anon_struct_4_3_f795cdaa_for_reg12 aVar17;
  anon_struct_4_3_f795cdea_for_reg13 aVar18;
  anon_struct_4_3_f795d56a_for_reg14 aVar19;
  anon_struct_4_3_f795d5aa_for_reg15 aVar20;
  anon_struct_4_3_c249374a_for_reg16 aVar21;
  anon_struct_4_3_c24937c5_for_reg17 aVar22;
  anon_struct_4_3_c2493f2a_for_reg18 aVar23;
  anon_struct_4_3_a38c4f29_for_reg19 aVar24;
  anon_struct_4_3_a38c5e4b_for_reg20 aVar25;
  anon_struct_4_2_eef66cc1_for_reg21 aVar26;
  anon_struct_4_3_f3bb698a_for_reg23 aVar27;
  anon_struct_4_3_f3bb69ca_for_reg24 aVar28;
  anon_struct_4_3_f3bb714a_for_reg25 aVar29;
  anon_struct_4_3_f3bb718a_for_reg26 aVar30;
  anon_struct_4_3_4b775b2a_for_reg27 aVar31;
  anon_struct_4_3_4b775ba5_for_reg28 aVar32;
  anon_struct_4_3_4b77630a_for_reg29 aVar33;
  anon_struct_4_3_4022a749_for_reg30 aVar34;
  anon_struct_4_3_4022b66b_for_reg31 aVar35;
  anon_struct_4_2_8b8cc4e1_for_reg32 aVar36;
  anon_struct_4_3_efe1056a_for_reg34 aVar37;
  anon_struct_4_3_efe105aa_for_reg35 aVar38;
  anon_struct_4_3_efe10d2a_for_reg36 aVar39;
  anon_struct_4_3_efe10d6a_for_reg37 aVar40;
  anon_struct_4_3_d4a57f0a_for_reg38 aVar41;
  anon_struct_4_3_d4a57f85_for_reg39 aVar42;
  anon_struct_4_3_d4a586ea_for_reg40 aVar43;
  anon_struct_4_3_dcb8ff69_for_reg41 aVar44;
  anon_struct_4_3_dcb90e8b_for_reg42 aVar45;
  anon_struct_4_2_28231d01_for_reg43 aVar46;
  anon_struct_4_3_ec06a14a_for_reg45 aVar47;
  anon_struct_4_3_ec06a18a_for_reg46 aVar48;
  anon_struct_4_3_ec06a90a_for_reg47 aVar49;
  anon_struct_4_3_ec06a94a_for_reg48 aVar50;
  anon_struct_4_3_5dd3a2ea_for_reg49 aVar51;
  anon_struct_4_3_5dd3a365_for_reg50 aVar52;
  anon_struct_4_3_5dd3aaca_for_reg51 aVar53;
  anon_struct_4_3_794f5789_for_reg52 aVar54;
  anon_struct_4_3_794f66ab_for_reg53 aVar55;
  anon_struct_4_2_c4b97521_for_reg54 aVar56;
  anon_struct_4_3_e82c3d2a_for_reg56 aVar57;
  anon_struct_4_3_e82c3d6a_for_reg57 aVar58;
  anon_struct_4_3_e82c44ea_for_reg58 aVar59;
  anon_struct_4_3_e82c452a_for_reg59 aVar60;
  anon_struct_4_3_e701c6ca_for_reg60 aVar61;
  anon_struct_4_3_e701c745_for_reg61 aVar62;
  anon_struct_4_3_e701ceaa_for_reg62 aVar63;
  anon_struct_4_3_15e5afa9_for_reg63 aVar64;
  anon_struct_4_3_15e5becb_for_reg64 aVar65;
  anon_struct_4_2_614fcd41_for_reg65 aVar66;
  anon_struct_4_3_e451d90a_for_reg67 aVar67;
  anon_struct_4_3_e451d94a_for_reg68 aVar68;
  anon_struct_4_3_e451e0ca_for_reg69 aVar69;
  anon_struct_4_3_e451e10a_for_reg70 aVar70;
  anon_struct_4_3_702feaaa_for_reg71 aVar71;
  anon_struct_4_3_702feb25_for_reg72 aVar72;
  anon_struct_4_3_702ff28a_for_reg73 aVar73;
  anon_struct_4_3_b27c07c9_for_reg74 aVar74;
  anon_struct_4_3_b27c16eb_for_reg75 aVar75;
  anon_struct_4_2_fde62561_for_reg76 aVar76;
  anon_struct_4_3_e07774ea_for_reg78 aVar77;
  anon_struct_4_3_e077752a_for_reg79 aVar78;
  anon_struct_4_3_e0777caa_for_reg80 aVar79;
  anon_struct_4_3_e0777cea_for_reg81 aVar80;
  anon_struct_4_3_f95e0e8a_for_reg82 aVar81;
  anon_struct_4_3_f95e0f05_for_reg83 aVar82;
  anon_struct_4_3_f95e166a_for_reg84 aVar83;
  anon_struct_4_3_4f125fe9_for_reg85 aVar84;
  anon_struct_4_3_4f126f0b_for_reg86 aVar85;
  anon_struct_4_2_9a7c7d81_for_reg87 aVar86;
  anon_struct_4_6_fef62f20_for_reg2 aVar87;
  anon_struct_4_7_566f0ca7_for_reg3 aVar88;
  anon_struct_4_5_5206536f_for_reg4 aVar89;
  anon_struct_4_5_5206cbae_for_reg6 aVar90;
  anon_struct_4_5_520743ed_for_reg8 aVar91;
  anon_struct_4_6_6b67bfe3_for_reg100 aVar92;
  anon_struct_4_8_1448ed05_for_reg102 aVar93;
  anon_struct_4_7_51a04710_for_reg103 aVar94;
  anon_struct_4_7_f4a15204_for_reg104 aVar95;
  anon_struct_4_7_13dfdf50_for_reg105 aVar96;
  anon_struct_4_7_15216c04_for_reg106 aVar97;
  anon_struct_4_7_1521e444_for_reg107 aVar98;
  RK_S32 RVar99;
  anon_struct_4_6_98c00d60_for_reg110 aVar100;
  anon_struct_4_5_4e72b6e0_for_reg112 aVar101;
  anon_struct_4_5_de9b1aa1_for_reg113 aVar102;
  anon_struct_4_5_8d760384_for_reg114 aVar103;
  anon_struct_4_4_9babbec2_for_reg129 aVar104;
  anon_struct_4_5_7a7ec4dc_for_reg130 aVar105;
  anon_struct_4_7_35acda4c_for_reg131 aVar106;
  anon_struct_4_5_713fce19_for_reg134 aVar107;
  anon_struct_4_5_098cd0aa_for_reg135 aVar108;
  anon_struct_4_7_7222c14c_for_reg136 aVar109;
  anon_struct_4_5_4b644edc_for_reg137 aVar110;
  anon_struct_4_6_1794af64_for_reg141 aVar111;
  anon_struct_4_6_e5dd6b84_for_reg142 aVar112;
  anon_struct_4_4_f8f30d03_for_reg143 aVar113;
  anon_struct_4_6_b61f7fc4_for_reg145 aVar114;
  anon_struct_4_6_e3c66fa4_for_reg146 aVar115;
  anon_struct_4_4_2f9cacc3_for_reg147 aVar116;
  anon_struct_4_6_54aa5024_for_reg149 aVar117;
  anon_struct_4_6_e1af73c4_for_reg150 aVar118;
  anon_struct_4_4_66464c83_for_reg151 aVar119;
  anon_struct_4_6_f3352084_for_reg153 aVar120;
  anon_struct_4_6_df9877e4_for_reg154 aVar121;
  anon_struct_4_4_9cefec43_for_reg155 aVar122;
  anon_struct_4_6_adc393a5_for_reg156 aVar123;
  anon_struct_4_5_5dea9ddc_for_reg157 aVar124;
  anon_struct_4_7_e0b31a4c_for_reg158 aVar125;
  anon_struct_4_4_73edf603_for_reg10 aVar126;
  anon_struct_4_4_73efd703_for_reg11 aVar127;
  anon_struct_4_4_73221983_for_reg13 aVar128;
  anon_struct_4_6_05954ecb_for_reg101 aVar129;
  anon_struct_4_3_724851b1_for_reg108 aVar130;
  anon_struct_4_5_7839e156_for_reg140 aVar131;
  anon_struct_4_5_7839e537_for_reg144 aVar132;
  anon_struct_4_5_7839e918_for_reg148 aVar133;
  anon_struct_4_5_7839ecf9_for_reg152 aVar134;
  ushort uVar135;
  ushort uVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  ushort uVar141;
  ushort uVar142;
  ushort uVar143;
  ushort uVar144;
  uint uVar145;
  int iVar146;
  MPP_RET extraout_EAX;
  long lVar147;
  byte bVar148;
  ushort uVar149;
  uint uVar150;
  uint uVar151;
  int iVar152;
  ushort uVar153;
  int iVar154;
  uint uVar155;
  uint uVar156;
  int iVar157;
  int iVar158;
  uint uVar159;
  int iVar160;
  int iVar161;
  anon_struct_4_5_566da832_for_reg16 aVar162;
  int iVar163;
  int iVar164;
  uint uVar165;
  int iVar166;
  uint uVar167;
  int iVar168;
  uint uVar169;
  int iVar170;
  RK_U32 RVar171;
  uint uVar172;
  uint uVar173;
  uint uVar174;
  double dVar175;
  double dVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  RK_U8 diff2conf_lut_k [8];
  RK_S32 peaking_ctrl_ratio_N12 [7];
  RK_S32 peaking_ctrl_ratio_N01 [7];
  RK_S32 peaking_ctrl_ratio_P23 [7];
  RK_S32 peaking_ctrl_ratio_P12 [7];
  RK_S32 peaking_ctrl_ratio_P01 [7];
  RK_S32 peaking_ctrl_value_P3 [7];
  RK_S32 peaking_ctrl_value_P2 [7];
  RK_S32 peaking_ctrl_value_P1 [7];
  RK_S32 peaking_ctrl_value_N3 [7];
  RK_S32 peaking_ctrl_value_N2 [7];
  RK_S32 peaking_ctrl_value_N1 [7];
  RK_S32 peaking_ctrl_idx_N3 [7];
  RK_S32 peaking_ctrl_idx_P3 [7];
  RK_S32 peaking_ctrl_idx_N2 [7];
  RK_S32 peaking_ctrl_idx_P2 [7];
  RK_S32 peaking_ctrl_idx_N1 [7];
  RK_S32 peaking_ctrl_idx_P1 [7];
  RK_S32 peaking_ctrl_idx_N0 [7];
  int local_2fc;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  undefined8 uStack_2d4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  uint local_298 [8];
  uint local_278 [8];
  uint local_258 [8];
  uint local_238 [8];
  uint local_218 [8];
  uint local_1f8 [8];
  uint local_1d8 [8];
  uint local_1b8 [8];
  uint local_198 [8];
  uint local_178 [8];
  uint local_158 [8];
  uint local_138 [8];
  uint local_118 [8];
  uint local_f8 [8];
  uint local_d8 [8];
  uint local_b8 [8];
  uint local_98 [8];
  uint local_78 [8];
  uint local_58 [10];
  
  uVar159 = 0;
  memset(&ctx->reg,0,0x440);
  *(undefined1 *)&(ctx->reg).common.reg0 = 1;
  aVar3 = (ctx->reg).common.reg1;
  (ctx->reg).common.reg1 = (anon_struct_4_17_f45c7487_for_reg1)((uint)aVar3 | 3);
  uVar150 = (uint)aVar3 & 0xffffffcf;
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)((src_params->src_yuv_swap & 3) << 4 | uVar150 | 3);
  if (src_params->src_fmt == 5) {
    (ctx->reg).common.reg1 = (anon_struct_4_17_f45c7487_for_reg1)(uVar150 | 0x13);
  }
  uVar150 = (src_params->dst_fmt & 3) << 8;
  aVar3 = (ctx->reg).common.reg1;
  (ctx->reg).common.reg1 = (anon_struct_4_17_f45c7487_for_reg1)((uint)aVar3 & 0xfffffcff | uVar150);
  uVar151 = (src_params->dst_yuv_swap & 3) << 0xc;
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)((uint)aVar3 & 0xffffccff | uVar150 | uVar151);
  if (src_params->working_mode != 3) {
    uVar159 = *(int *)&src_params->dmsr_params << 0x18;
  }
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)((uint)aVar3 & 0xfeffccff | uVar150 | uVar151 | uVar159);
  *(byte *)&(ctx->reg).common.reg2 =
       *(byte *)&(ctx->reg).common.reg2 & 0xfc | (byte)src_params->working_mode & 3;
  if (((byte)vdpp2_debug & 1) != 0) {
    _mpp_log_l(4,"vdpp2","working_mode %d",(char *)0x0,(ulong)src_params->working_mode);
  }
  paVar1 = &(ctx->reg).common.reg4;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0xfff;
  paVar2 = &(ctx->reg).common.reg8;
  *(byte *)paVar2 = *(byte *)paVar2 | 0x73;
  uVar159 = src_params->src_width & 0xf;
  uVar150 = 0x10 - uVar159;
  if (uVar159 == 0) {
    uVar150 = 0;
  }
  uVar151 = src_params->src_height & 7;
  uVar159 = 8 - uVar151;
  if (uVar151 == 0) {
    uVar159 = 0;
  }
  uVar145 = src_params->dst_width & 0xf;
  uVar151 = 0x10 - uVar145;
  if (uVar145 == 0) {
    uVar151 = 0;
  }
  *(short *)&(ctx->reg).common.reg12 = (short)(src_params->src_width_vir >> 2);
  uVar145 = src_params->dst_width_vir >> 2;
  *(short *)&(ctx->reg).common.reg13 = (short)uVar145;
  aVar4 = (ctx->reg).common.reg14;
  uVar150 = (uVar150 & 0xf) << 0xc | (uVar150 + src_params->src_width) - 1 & 0x7ff;
  (ctx->reg).common.reg14 = (anon_struct_4_6_2c2caa47_for_reg14)(uVar150 | (uint)aVar4 & 0xffff0800)
  ;
  (ctx->reg).common.reg14 =
       (anon_struct_4_6_2c2caa47_for_reg14)
       ((uVar159 & 7) << 0x1c | uVar150 | (uint)aVar4 & 0x88000800 |
       (src_params->src_height + uVar159) * 0x10000 + 0x7ff0000 & 0x7ff0000);
  aVar5 = (ctx->reg).common.reg15;
  uVar150 = (uVar151 & 0xf) << 0xc | (src_params->dst_width + uVar151) - 1 & 0x7ff;
  (ctx->reg).common.reg15 = (anon_struct_4_4_4045accf_for_reg15)(uVar150 | (uint)aVar5 & 0xffff0800)
  ;
  (ctx->reg).common.reg15 =
       (anon_struct_4_4_4045accf_for_reg15)
       (uVar150 | (uint)aVar5 & 0xf8000800 |
       src_params->dst_height * 0x10000 + 0x7ff0000 & 0x7ff0000);
  (ctx->reg).common.reg20 = (anon_struct_4_2_3349d787_for_reg20)0x88ffffff;
  (ctx->reg).common.reg24 = (anon_struct_4_1_9b21a0fa_for_reg24)(src_params->src).y;
  (ctx->reg).common.reg25 = (anon_struct_4_1_c9127a9e_for_reg25)(src_params->src).cbcr;
  (ctx->reg).common.reg26 = (anon_struct_4_1_c50c69f9_for_reg26)(src_params->dst).y;
  (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst).cbcr;
  if (src_params->yuv_out_diff != 0) {
    uVar159 = src_params->dst_c_width & 0xf;
    uVar150 = 0x10 - uVar159;
    if (uVar159 == 0) {
      uVar150 = 0;
    }
    (ctx->reg).common.reg1 =
         (anon_struct_4_17_f45c7487_for_reg1)
         ((uint)(ctx->reg).common.reg1 & 0xfffffbff | (src_params->yuv_out_diff & 1) << 10);
    (ctx->reg).common.reg13 =
         (anon_struct_4_2_b89f876b_for_reg13)
         ((src_params->dst_c_width_vir & 0xfffffffc) << 0xe | uVar145 & 0xffff);
    aVar6 = (ctx->reg).common.reg16;
    uVar150 = (uVar150 & 0xf) << 0xc | (src_params->dst_c_width + uVar150) - 1 & 0x7ff;
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)(uVar150 | (uint)aVar6 & 0xffff0800);
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)
         (uVar150 | (uint)aVar6 & 0xf8000800 |
         src_params->dst_c_height * 0x10000 + 0x7ff0000 & 0x7ff0000);
    (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst_c).cbcr;
  }
  set_dmsr_to_vdpp_reg(&src_params->dmsr_params,&ctx->dmsr);
  update_dci_ctl(src_params);
  switch(src_params->dci_format) {
  case 0:
    RVar171 = src_params->src_width_vir * 3;
    goto LAB_0013dd72;
  case 1:
    uVar150 = (uint)(ushort)src_params->src_width_vir;
    break;
  default:
    _mpp_log_l(2,"vdpp2","warning: unsupported dci format %d",(char *)0x0);
    goto LAB_0013e049;
  case 4:
    RVar171 = src_params->src_width_vir;
LAB_0013dd72:
    uVar150 = RVar171 >> 2;
    break;
  case 5:
    uVar150 = src_params->src_width_vir * 10 >> 5;
  }
  uVar159 = src_params->dci_vsd_mode;
  if ((src_params->dci_hsd_mode & 1) == 0) {
    iVar157 = 0;
    if (0x780 < src_params->src_width_vir) {
      if (((byte)vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","w_vir %d hsd mode %d is optimized as mode 1\n",(char *)0x0,
                   (ulong)src_params->src_width_vir,0);
      }
      goto LAB_0013ddd3;
    }
  }
  else {
LAB_0013ddd3:
    iVar157 = 1;
  }
  uVar151 = uVar159 & 3;
  if ((((uVar159 & 1) == 0) && (0x438 < src_params->src_height_vir)) &&
     (uVar151 = 1, ((byte)vdpp2_debug & 2) != 0)) {
    _mpp_log_l(4,"vdpp2","h_vir %d vsd mode %d is optimized as mode 1\n",(char *)0x0);
  }
  uVar159 = uVar151;
  if (((uVar151 < 2) && (0x870 < src_params->src_height_vir)) &&
     (uVar159 = 2, ((byte)vdpp2_debug & 2) != 0)) {
    _mpp_log_l(4,"vdpp2","h_vir %d vsd mode %d is optimized as mode 2\n",(char *)0x0,
               (ulong)src_params->src_height_vir,(ulong)uVar151);
  }
  if (src_params->working_mode == 2) {
    iVar157 = 0;
    uVar159 = 0;
  }
  iVar158 = 4;
  if (uVar159 != 2) {
    iVar158 = (uVar159 == 1) + 1;
  }
  bVar148 = 6;
  if (uVar159 != 2) {
    bVar148 = uVar159 == 1 | 4;
  }
  uVar151 = src_params->src_height;
  uVar145 = (uVar151 - 1) + iVar158 * 0x10;
  if (uVar151 < 0x438) {
    uVar145 = uVar151;
  }
  uVar151 = src_params->src_width;
  uVar155 = iVar157 << 5 | 0x1f;
  if (uVar151 < 0x438) {
    uVar155 = 0;
  }
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)
       ((uint)(ctx->reg).common.reg1 & 0xfdffffff | (src_params->hist_cnt_en & 1) << 0x19);
  (ctx->reg).dci.reg0 = (anon_struct_4_1_3a028d4a_for_reg0)(src_params->src).y;
  uVar156 = (uint)*(ushort *)&(ctx->reg).dci.reg1.field_0x2 << 0x10;
  uVar150 = uVar150 & 0xffff;
  (ctx->reg).dci.reg1 = (anon_struct_4_3_07565349_for_reg1)(uVar150 | uVar156);
  uVar165 = (src_params->dci_yrgb_gather_num & 0xf) << 0x10;
  (ctx->reg).dci.reg1 =
       (anon_struct_4_3_07565349_for_reg1)(uVar150 | uVar156 & 0xfff0ffff | uVar165);
  (ctx->reg).dci.reg1 =
       (anon_struct_4_3_07565349_for_reg1)
       (uVar150 | uVar156 & 0xffe0ffff | uVar165 | (src_params->dci_yrgb_gather_en & 1) << 0x14);
  uVar150 = (((uint)(byte)~(byte)iVar157 * 2 | 0xffc) & src_params->src_width) - 1 & 0xfff;
  aVar7 = (ctx->reg).dci.reg2;
  (ctx->reg).dci.reg2 = (anon_struct_4_3_89b91cde_for_reg2)((uint)aVar7 & 0xfffff000 | uVar150);
  (ctx->reg).dci.reg2 =
       (anon_struct_4_3_89b91cde_for_reg2)
       ((uint)aVar7 & 0xf000f000 | uVar150 |
       (-iVar158 & src_params->src_height) * 0x10000 + 0xfff0000 & 0xfff0000);
  aVar8 = (ctx->reg).dci.reg3;
  uVar150 = src_params->dci_format & 7;
  (ctx->reg).dci.reg3 = (anon_struct_4_9_24a09030_for_reg3)((uint)aVar8 & 0xfffffff8 | uVar150);
  uVar150 = (uVar159 << 4 | (uint)aVar8 & 0xffffff80 | uVar150) +
            (src_params->dci_csc_range & 1U) * 8;
  uVar156 = iVar157 << 6;
  (ctx->reg).dci.reg3 = (anon_struct_4_9_24a09030_for_reg3)(uVar156 | uVar150);
  uVar159 = (src_params->dci_alpha_swap & 1U) << 7;
  (ctx->reg).dci.reg3 =
       (anon_struct_4_9_24a09030_for_reg3)(uVar156 | uVar150 & 0xffffff7f | uVar159);
  (ctx->reg).dci.reg3 =
       (anon_struct_4_9_24a09030_for_reg3)
       ((uVar155 + uVar151 >> (byte)iVar157 + 5 & 0xff) << 0x10 | (uVar145 >> bVar148) << 0x18 |
        (src_params->dci_rbuv_swap & 1U) << 8 | uVar156 | uVar150 & 0xfe7f | uVar159);
  (ctx->reg).dci.reg4 = (anon_struct_4_1_540e9c9c_for_reg4)src_params->hist;
LAB_0013e049:
  _local_2e8 = 0;
  uVar150 = (src_params->es_params).es_iWgtGain;
  uVar159 = (src_params->es_params).es_iWgtLocalTh;
  update_es_tan(&src_params->es_params);
  *(byte *)&(ctx->reg).es.reg0 =
       *(byte *)&(ctx->reg).es.reg0 & 0xfe | (byte)(src_params->es_params).es_bEnabledES & 1;
  RVar171 = (src_params->es_params).es_iGradNoDirTh;
  (ctx->reg).es.reg1.field_0x1 = (char)RVar171;
  *(ushort *)&(ctx->reg).es.reg1 =
       (ushort)(byte)(src_params->es_params).es_iGradFlatTh | (ushort)(RVar171 << 8);
  uVar151 = ((src_params->es_params).es_tan_lo_th & 0x1ff) << 0x10;
  aVar9 = (ctx->reg).es.reg2;
  (ctx->reg).es.reg2 = (anon_struct_4_3_30fecd47_for_reg2)((uint)aVar9 & 0xfe00ffff | uVar151);
  (ctx->reg).es.reg2 =
       (anon_struct_4_3_30fecd47_for_reg2)
       ((uint)aVar9 & 0xfe00fe00 | uVar151 | (src_params->es_params).es_tan_hi_th & 0x1ff);
  *(ushort *)&(ctx->reg).es.reg3 =
       SUB42((ctx->reg).es.reg3,0) & 0xfffe |
       (ushort)(src_params->es_params).es_bEndpointCheckEnable & 1;
  uVar151 = (src_params->es_params).es_iK1;
  *(short *)&(ctx->reg).es.reg4 = (short)uVar151;
  (ctx->reg).es.reg4 =
       (anon_struct_4_2_34aad9ab_for_reg4)
       ((src_params->es_params).es_iDeltaLimit << 0x10 | uVar151 & 0xffff);
  RVar171 = (src_params->es_params).es_iK2;
  *(short *)&(ctx->reg).es.reg5.field_0x2 = (short)RVar171;
  (ctx->reg).es.reg5 =
       (anon_struct_4_2_9ad3edb5_for_reg5)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[0] | RVar171 << 0x10);
  RVar171 = (src_params->es_params).es_iDiff2conf_lut_x[1];
  *(short *)&(ctx->reg).es.reg6.field_0x2 = (short)RVar171;
  (ctx->reg).es.reg6 =
       (anon_struct_4_2_02c81542_for_reg6)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[2] | RVar171 << 0x10);
  RVar171 = (src_params->es_params).es_iDiff2conf_lut_x[3];
  *(short *)&(ctx->reg).es.reg7.field_0x2 = (short)RVar171;
  (ctx->reg).es.reg7 =
       (anon_struct_4_2_02c81582_for_reg7)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[4] | RVar171 << 0x10);
  RVar171 = (src_params->es_params).es_iDiff2conf_lut_x[5];
  *(short *)&(ctx->reg).es.reg8.field_0x2 = (short)RVar171;
  (ctx->reg).es.reg8 =
       (anon_struct_4_2_02c815c2_for_reg8)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[6] | RVar171 << 0x10);
  RVar171 = (src_params->es_params).es_iDiff2conf_lut_x[7];
  *(short *)&(ctx->reg).es.reg9.field_0x2 = (short)RVar171;
  (ctx->reg).es.reg9 =
       (anon_struct_4_2_02c81602_for_reg9)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[8] | RVar171 << 0x10);
  bVar148 = (byte)(src_params->es_params).es_iDiff2conf_lut_y[0];
  aVar126._1_3_ = SUB43((ctx->reg).es.reg10,1);
  aVar126._0_1_ = bVar148;
  (ctx->reg).es.reg10 = aVar126;
  uVar151 = ((src_params->es_params).es_iDiff2conf_lut_y[1] & 0xff) << 8;
  (ctx->reg).es.reg10 = (anon_struct_4_4_73edf603_for_reg10)((uint)aVar126 & 0xffff00ff | uVar151);
  uVar145 = ((src_params->es_params).es_iDiff2conf_lut_y[2] & 0xff) << 0x10;
  (ctx->reg).es.reg10 =
       (anon_struct_4_4_73edf603_for_reg10)((uint)aVar126 & 0xff0000ff | uVar151 | uVar145);
  (ctx->reg).es.reg10 =
       (anon_struct_4_4_73edf603_for_reg10)
       (bVar148 | uVar151 | uVar145 | (src_params->es_params).es_iDiff2conf_lut_y[3] << 0x18);
  bVar148 = (byte)(src_params->es_params).es_iDiff2conf_lut_y[4];
  aVar127._1_3_ = SUB43((ctx->reg).es.reg11,1);
  aVar127._0_1_ = bVar148;
  (ctx->reg).es.reg11 = aVar127;
  uVar145 = ((src_params->es_params).es_iDiff2conf_lut_y[5] & 0xff) << 8;
  (ctx->reg).es.reg11 = (anon_struct_4_4_73efd703_for_reg11)((uint)aVar127 & 0xffff00ff | uVar145);
  uVar151 = ((src_params->es_params).es_iDiff2conf_lut_y[6] & 0xff) << 0x10;
  (ctx->reg).es.reg11 =
       (anon_struct_4_4_73efd703_for_reg11)((uint)aVar127 & 0xff0000ff | uVar145 | uVar151);
  (ctx->reg).es.reg11 =
       (anon_struct_4_4_73efd703_for_reg11)
       (bVar148 | uVar145 | uVar151 | (src_params->es_params).es_iDiff2conf_lut_y[7] << 0x18);
  *(char *)&(ctx->reg).es.reg12 = (char)(src_params->es_params).es_iDiff2conf_lut_y[8];
  lVar147 = 0;
  do {
    dVar175 = (((double)(src_params->es_params).es_iDiff2conf_lut_y[lVar147 + 1] -
               (double)(src_params->es_params).es_iDiff2conf_lut_y[lVar147]) * 256.0) /
              ((double)(src_params->es_params).es_iDiff2conf_lut_x[lVar147 + 1] -
              (double)(src_params->es_params).es_iDiff2conf_lut_x[lVar147]);
    dVar176 = dVar175 + -1.0;
    if ((double)(int)dVar175 <= dVar175) {
      dVar176 = dVar175;
    }
    iVar157 = (int)dVar176;
    if (0xfe < iVar157) {
      iVar157 = 0xff;
    }
    if (iVar157 < 1) {
      iVar157 = 0;
    }
    *(char *)((long)&local_2e8 + lVar147) = (char)iVar157;
    lVar147 = lVar147 + 1;
  } while (lVar147 != 8);
  uVar150 = (uint)(((float)uVar159 * 256.0) / (float)uVar150);
  if (0xfe < (int)uVar150) {
    uVar150 = 0xff;
  }
  uVar159 = 0;
  if (0 < (int)uVar150) {
    uVar159 = uVar150;
  }
  aVar10 = (ctx->reg).es.reg14;
  aVar128._1_3_ = SUB43((ctx->reg).es.reg13,1);
  aVar128._0_1_ = (undefined1)local_2e8;
  (ctx->reg).es.reg13 = aVar128;
  (ctx->reg).es.reg13 =
       (anon_struct_4_4_73221983_for_reg13)((uint)aVar128 & 0xffff00ff | (uint)local_2e8._1_1_ << 8)
  ;
  (ctx->reg).es.reg13 =
       (anon_struct_4_4_73221983_for_reg13)
       ((uint)aVar128 & 0xff0000ff | (uint)local_2e8._1_1_ << 8 | (uint)local_2e8._2_1_ << 0x10);
  (ctx->reg).es.reg13 = SUB84(_local_2e8,0);
  aVar10._1_3_ = aVar10._1_3_;
  aVar10._0_1_ = (undefined1)uStack_2e4;
  (ctx->reg).es.reg14 = aVar10;
  (ctx->reg).es.reg14 =
       (anon_struct_4_4_7323fa83_for_reg14)((uint)aVar10 & 0xffff00ff | (uint)uStack_2e4._1_1_ << 8)
  ;
  (ctx->reg).es.reg14 =
       (anon_struct_4_4_7323fa83_for_reg14)
       ((uint)aVar10 & 0xff0000ff | (uint)uStack_2e4._1_1_ << 8 | (uint)uStack_2e4._2_1_ << 0x10);
  (ctx->reg).es.reg14 = SUB84((ulong)_local_2e8 >> 0x20,0);
  RVar171 = (src_params->es_params).es_iWgtDecay;
  *(char *)&(ctx->reg).es.reg15 = (char)RVar171;
  *(ushort *)&(ctx->reg).es.reg15 =
       (ushort)((src_params->es_params).es_iWgtGain << 8) | (ushort)RVar171 & 0xff;
  aVar162 = (anon_struct_4_5_566da832_for_reg16)((uint)(ctx->reg).es.reg16 & 0xffffff00 | uVar159);
  (ctx->reg).es.reg16 = aVar162;
  uVar150 = ((src_params->es_params).es_iConfCntTh & 0xf) << 8;
  (ctx->reg).es.reg16 = (anon_struct_4_5_566da832_for_reg16)((uint)aVar162 & 0xfffff0ff | uVar150);
  uVar159 = (src_params->es_params).es_iLowConfTh << 0x18;
  (ctx->reg).es.reg16 =
       (anon_struct_4_5_566da832_for_reg16)((uint)aVar162 & 0xfff0ff | uVar150 | uVar159);
  (ctx->reg).es.reg16 =
       (anon_struct_4_5_566da832_for_reg16)
       ((uint)aVar162 & 0xf0ff | uVar150 | uVar159 |
       ((src_params->es_params).es_iLowConfRatio & 0xff) << 0x10);
  uStack_2d8 = 0;
  uStack_2d4 = 0;
  _local_2e8 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_d8[4] = 0;
  local_d8[5] = 0;
  local_d8[6] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  local_f8[4] = 0;
  local_f8[5] = 0;
  local_f8[6] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_158[4] = 0;
  local_158[5] = 0;
  local_158[6] = 0;
  local_158[0] = 0;
  local_158[1] = 0;
  local_158[2] = 0;
  local_158[3] = 0;
  local_178[4] = 0;
  local_178[5] = 0;
  local_178[6] = 0;
  local_178[0] = 0;
  local_178[1] = 0;
  local_178[2] = 0;
  local_178[3] = 0;
  local_198[4] = 0;
  local_198[5] = 0;
  local_198[6] = 0;
  local_198[0] = 0;
  local_198[1] = 0;
  local_198[2] = 0;
  local_198[3] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[6] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  local_1d8[4] = 0;
  local_1d8[5] = 0;
  local_1d8[6] = 0;
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  local_1d8[2] = 0;
  local_1d8[3] = 0;
  local_1f8[4] = 0;
  local_1f8[5] = 0;
  local_1f8[6] = 0;
  local_1f8[0] = 0;
  local_1f8[1] = 0;
  local_1f8[2] = 0;
  local_1f8[3] = 0;
  local_218[4] = 0;
  local_218[5] = 0;
  local_218[6] = 0;
  local_218[0] = 0;
  local_218[1] = 0;
  local_218[2] = 0;
  local_218[3] = 0;
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[6] = 0;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  local_258[4] = 0;
  local_258[5] = 0;
  local_258[6] = 0;
  local_258[0] = 0;
  local_258[1] = 0;
  local_258[2] = 0;
  local_258[3] = 0;
  local_278[4] = 0;
  local_278[5] = 0;
  local_278[6] = 0;
  local_278[0] = 0;
  local_278[1] = 0;
  local_278[2] = 0;
  local_278[3] = 0;
  local_298[4] = 0;
  local_298[5] = 0;
  local_298[6] = 0;
  local_298[0] = 0;
  local_298[1] = 0;
  local_298[2] = 0;
  local_298[3] = 0;
  uVar153 = (ushort)(src_params->shp_params).sharp_enable & 1;
  uVar149 = SUB42((ctx->reg).sharp.reg0,0);
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar149 & 0xfffe | uVar153;
  uVar144 = 2;
  if ((src_params->shp_params).lti_h_enable == 0) {
    uVar144 = (ushort)((src_params->shp_params).lti_v_enable != 0) * 2;
  }
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar144 | uVar149 & 0xfffc | uVar153;
  uVar149 = (uVar144 | uVar149 & 0xfff8 | uVar153) +
            ((ushort)(src_params->shp_params).cti_h_enable & 1) * 4;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar149;
  uVar153 = (uVar149 & 0xfff7) + ((ushort)(src_params->shp_params).peaking_enable & 1) * 8;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar153;
  uVar149 = 0x10;
  if (((src_params->shp_params).peaking_coring_enable == 0) &&
     ((src_params->shp_params).peaking_gain_enable == 0)) {
    uVar149 = (ushort)((src_params->shp_params).peaking_limit_ctrl_enable != 0) << 4;
  }
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar149 | uVar153 & 0xffef;
  uVar135 = (ushort)(((src_params->shp_params).peaking_edge_ctrl_enable & 1U) << 6);
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar149 | uVar153 & 0xffaf | uVar135;
  uVar136 = (ushort)(((src_params->shp_params).shootctrl_enable & 1U) << 7);
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar149 | uVar153 & 0xff2f | uVar135 | uVar136;
  uVar142 = (ushort)(((src_params->shp_params).global_gain_enable & 1U) << 8);
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar149 | uVar153 & 0xfe2f | uVar135 | uVar136 | uVar142;
  uVar143 = (ushort)(((src_params->shp_params).color_ctrl_enable & 1U) << 9);
  *(ushort *)&(ctx->reg).sharp.reg0 =
       uVar149 | uVar153 & 0xfc2f | uVar135 | uVar136 | uVar142 | uVar143;
  uVar141 = (ushort)(((src_params->shp_params).tex_adj_enable & 1U) << 10);
  *(ushort *)&(ctx->reg).sharp.reg0 =
       uVar149 | uVar153 & 0xf82f | uVar135 | uVar136 | uVar142 | uVar143 | uVar141;
  *(ushort *)&(ctx->reg).sharp.reg0 =
       uVar149 | uVar153 & 0xc02f | uVar135 | uVar136 | uVar142 | uVar143 | uVar141 |
       (ushort)(((src_params->shp_params).sharp_coloradj_bypass_en & 1U) << 0xb);
  if ((uVar144 != 0) && ((src_params->shp_params).lti_h_enable == 0)) {
    (src_params->shp_params).lti_h_gain = 0;
  }
  if ((((uint)(ctx->reg).sharp.reg0 & 2) != 0) && ((src_params->shp_params).lti_v_enable == 0)) {
    (src_params->shp_params).lti_v_gain = 0;
  }
  uVar150 = (src_params->shp_params).lti_h_radius & 1;
  aVar11 = (ctx->reg).sharp.reg162;
  aVar12 = (ctx->reg).sharp.reg164;
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)((uint)aVar11 & 0xfffffffe | uVar150);
  uVar159 = ((src_params->shp_params).lti_h_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)((uint)aVar11 & 0xffffe00e | uVar150 | uVar159);
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)
       ((uint)aVar11 & 0xfe00e00e | uVar150 | uVar159 |
       ((src_params->shp_params).lti_h_thresold & 0x1ffU) << 0x10);
  uVar150 = (src_params->shp_params).lti_h_noise_thr_neg & 0x3ff;
  aVar13 = (ctx->reg).sharp.reg163;
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)((uint)aVar13 & 0xfffffc00 | uVar150);
  uVar159 = ((src_params->shp_params).lti_h_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)((uint)aVar13 & 0xffc00c00 | uVar150 | uVar159);
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)
       ((uint)aVar13 & 0xe0c00c00 | uVar150 | uVar159 |
       ((src_params->shp_params).lti_h_gain & 0x1fU) << 0x18);
  uVar150 = (src_params->shp_params).lti_v_radius & 1;
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)((uint)aVar12 & 0xfffffffe | uVar150);
  uVar159 = ((src_params->shp_params).lti_v_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)((uint)aVar12 & 0xffffe00e | uVar150 | uVar159);
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)
       ((uint)aVar12 & 0xfe00e00e | uVar150 | uVar159 |
       ((src_params->shp_params).lti_v_thresold & 0x1ffU) << 0x10);
  uVar150 = (src_params->shp_params).lti_v_noise_thr_neg & 0x3ff;
  aVar14 = (ctx->reg).sharp.reg165;
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)((uint)aVar14 & 0xfffffc00 | uVar150);
  uVar159 = ((src_params->shp_params).lti_v_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)((uint)aVar14 & 0xffc00c00 | uVar150 | uVar159);
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)
       ((uint)aVar14 & 0xe0c00c00 | uVar150 | uVar159 |
       ((src_params->shp_params).lti_v_gain & 0x1fU) << 0x18);
  aVar15 = (ctx->reg).sharp.reg166;
  uVar150 = (src_params->shp_params).cti_h_radius & 1;
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)((uint)aVar15 & 0xfffffffe | uVar150);
  uVar159 = ((src_params->shp_params).cti_h_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)((uint)aVar15 & 0xffffe00e | uVar150 | uVar159);
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)
       ((uint)aVar15 & 0xfe00e00e | uVar150 | uVar159 |
       ((src_params->shp_params).cti_h_thresold & 0x1ffU) << 0x10);
  uVar159 = (src_params->shp_params).cti_h_noise_thr_neg & 0x3ff;
  aVar16 = (ctx->reg).sharp.reg167;
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)((uint)aVar16 & 0xfffffc00 | uVar159);
  uVar150 = ((src_params->shp_params).cti_h_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)((uint)aVar16 & 0xffc00c00 | uVar159 | uVar150);
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)
       ((uint)aVar16 & 0xe0c00c00 | uVar159 | uVar150 |
       ((src_params->shp_params).cti_h_gain & 0x1fU) << 0x18);
  local_2b0 = (src_params->shp_params).peaking_coring_enable;
  local_2b4 = (src_params->shp_params).peaking_gain_enable;
  local_2b8 = (src_params->shp_params).peaking_limit_ctrl_enable;
  lVar147 = 0;
  do {
    iVar158 = 0x400;
    iVar157 = 0x400;
    local_2a0 = 0;
    iVar163 = 0;
    if (local_2b0 == 1) {
      iVar157 = *(int *)((long)(src_params->shp_params).peaking_coring_ratio + lVar147);
      local_2a0 = *(int *)((long)(src_params->shp_params).peaking_coring_zero + lVar147) >> 2;
      iVar163 = *(int *)((long)(src_params->shp_params).peaking_coring_thr + lVar147) >> 2;
    }
    local_2a4 = 0x400;
    if (local_2b4 == 1) {
      iVar158 = *(int *)((long)(src_params->shp_params).peaking_gain_pos + lVar147);
      local_2a4 = *(int *)((long)(src_params->shp_params).peaking_gain_neg + lVar147);
    }
    if (local_2b8 == 1) {
      local_2fc = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_pos0 + lVar147) >> 2;
      local_2c0 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_pos1 + lVar147) >> 2;
      iVar160 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_neg0 + lVar147) >> 2;
      iVar154 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_neg1 + lVar147) >> 2;
      iVar161 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_ratio + lVar147);
    }
    else {
      iVar161 = 0x400;
      local_2fc = 0x3f;
      local_2c0 = 0x3f;
      iVar160 = 0x3f;
      iVar154 = 0x3f;
    }
    iVar152 = -local_2a0;
    *(int *)((long)local_58 + lVar147) = iVar152;
    iVar164 = -iVar163;
    iVar166 = -iVar160;
    iVar168 = -iVar154;
    local_29c = iVar158 * iVar157 + 0x200 >> 10;
    iVar157 = iVar157 * local_2a4 + 0x200 >> 10;
    local_2ac = local_29c * (iVar163 - local_2a0) + 0x200 >> 10;
    iVar146 = -((iVar163 - local_2a0) * iVar157 + 0x200 >> 10);
    local_2a8 = iVar146 - ((iVar160 - iVar163) * local_2a4 + 0x200 >> 10);
    iVar170 = iVar161 * local_2a4 + 0x200 >> 10;
    local_2bc = local_2a8 - ((iVar154 - iVar160) * iVar170 + 0x200 >> 10);
    iVar154 = ((local_2fc - iVar163) * iVar158 + 0x200 >> 10) + local_2ac;
    iVar161 = iVar161 * iVar158 + 0x200 >> 10;
    iVar160 = ((local_2c0 - local_2fc) * iVar161 + 0x200 >> 10) + iVar154;
    if (0xfe < iVar152) {
      iVar152 = 0xff;
    }
    if (iVar152 < -0xff) {
      iVar152 = -0x100;
    }
    *(int *)((long)local_58 + lVar147) = iVar152;
    *(int *)((long)local_98 + lVar147) = iVar164;
    if (0xfe < iVar164) {
      iVar164 = 0xff;
    }
    if (iVar164 < -0xff) {
      iVar164 = -0x100;
    }
    *(int *)((long)local_98 + lVar147) = iVar164;
    *(int *)((long)local_d8 + lVar147) = iVar166;
    if (0xfe < iVar166) {
      iVar166 = 0xff;
    }
    if (iVar166 < -0xff) {
      iVar166 = -0x100;
    }
    *(int *)((long)local_d8 + lVar147) = iVar166;
    *(int *)((long)local_118 + lVar147) = iVar168;
    if (0xfe < iVar168) {
      iVar168 = 0xff;
    }
    if (iVar168 < -0xff) {
      iVar168 = -0x100;
    }
    *(int *)((long)local_118 + lVar147) = iVar168;
    *(int *)((long)&local_2e8 + lVar147) = local_2a0;
    iVar152 = local_2a0;
    if (0xfe < local_2a0) {
      iVar152 = 0xff;
    }
    if (iVar152 < -0xff) {
      iVar152 = -0x100;
    }
    *(int *)((long)&local_2e8 + lVar147) = iVar152;
    *(int *)((long)local_78 + lVar147) = iVar163;
    if (0xfe < iVar163) {
      iVar163 = 0xff;
    }
    if (iVar163 < -0xff) {
      iVar163 = -0x100;
    }
    *(int *)((long)local_78 + lVar147) = iVar163;
    *(int *)((long)local_b8 + lVar147) = local_2fc;
    if (0xfe < local_2fc) {
      local_2fc = 0xff;
    }
    if (local_2fc < -0xff) {
      local_2fc = -0x100;
    }
    *(int *)((long)local_b8 + lVar147) = local_2fc;
    *(int *)((long)local_f8 + lVar147) = local_2c0;
    iVar163 = local_2c0;
    if (0xfe < local_2c0) {
      iVar163 = 0xff;
    }
    if (iVar163 < -0xff) {
      iVar163 = -0x100;
    }
    *(int *)((long)local_f8 + lVar147) = iVar163;
    *(int *)((long)local_198 + lVar147) = local_2ac;
    *(int *)((long)local_138 + lVar147) = iVar146;
    *(int *)((long)local_1f8 + lVar147) = local_29c;
    *(int *)((long)local_258 + lVar147) = iVar157;
    *(int *)((long)local_218 + lVar147) = iVar158;
    *(int *)((long)local_278 + lVar147) = local_2a4;
    *(int *)((long)local_1b8 + lVar147) = iVar154;
    *(int *)((long)local_158 + lVar147) = local_2a8;
    *(int *)((long)local_1d8 + lVar147) = iVar160;
    *(int *)((long)local_178 + lVar147) = local_2bc;
    *(int *)((long)local_238 + lVar147) = iVar161;
    *(int *)((long)local_298 + lVar147) = iVar170;
    if (0xfe < iVar146) {
      iVar146 = 0xff;
    }
    if (iVar146 < -0xff) {
      iVar146 = -0x100;
    }
    *(int *)((long)local_138 + lVar147) = iVar146;
    iVar163 = local_2a8;
    if (0xfe < local_2a8) {
      iVar163 = 0xff;
    }
    if (iVar163 < -0xff) {
      iVar163 = -0x100;
    }
    *(int *)((long)local_158 + lVar147) = iVar163;
    iVar163 = local_2bc;
    if (0xfe < local_2bc) {
      iVar163 = 0xff;
    }
    if (iVar163 < -0xff) {
      iVar163 = -0x100;
    }
    *(int *)((long)local_178 + lVar147) = iVar163;
    iVar163 = local_2ac;
    if (0xfe < local_2ac) {
      iVar163 = 0xff;
    }
    if (iVar163 < -0xff) {
      iVar163 = -0x100;
    }
    *(int *)((long)local_198 + lVar147) = iVar163;
    if (0xfe < iVar154) {
      iVar154 = 0xff;
    }
    if (iVar154 < -0xff) {
      iVar154 = -0x100;
    }
    *(int *)((long)local_1b8 + lVar147) = iVar154;
    if (0xfe < iVar160) {
      iVar160 = 0xff;
    }
    if (iVar160 < -0xff) {
      iVar160 = -0x100;
    }
    *(int *)((long)local_1d8 + lVar147) = iVar160;
    iVar163 = local_29c;
    if (0xffe < local_29c) {
      iVar163 = 0xfff;
    }
    if (iVar163 < 1) {
      iVar163 = 0;
    }
    *(int *)((long)local_1f8 + lVar147) = iVar163;
    if (0xffe < iVar158) {
      iVar158 = 0xfff;
    }
    if (iVar158 < 1) {
      iVar158 = 0;
    }
    *(int *)((long)local_218 + lVar147) = iVar158;
    if (0xffe < iVar161) {
      iVar161 = 0xfff;
    }
    if (iVar161 < 1) {
      iVar161 = 0;
    }
    *(int *)((long)local_238 + lVar147) = iVar161;
    if (0xffe < iVar157) {
      iVar157 = 0xfff;
    }
    if (iVar157 < 1) {
      iVar157 = 0;
    }
    *(int *)((long)local_258 + lVar147) = iVar157;
    iVar157 = local_2a4;
    if (0xffe < local_2a4) {
      iVar157 = 0xfff;
    }
    if (iVar157 < 1) {
      iVar157 = 0;
    }
    *(int *)((long)local_278 + lVar147) = iVar157;
    if (0xffe < iVar170) {
      iVar170 = 0xfff;
    }
    if (iVar170 < 1) {
      iVar170 = 0;
    }
    *(int *)((long)local_298 + lVar147) = iVar170;
    lVar147 = lVar147 + 4;
  } while (lVar147 != 0x1c);
  aVar17 = (ctx->reg).sharp.reg12;
  (ctx->reg).sharp.reg12 =
       (anon_struct_4_3_f795cdaa_for_reg12)((uint)aVar17 & 0xfffffe00 | local_58[0] & 0x1ff);
  (ctx->reg).sharp.reg12 =
       (anon_struct_4_3_f795cdaa_for_reg12)
       ((uint)aVar17 & 0xfe00fe00 | local_58[0] & 0x1ff | (local_98[0] & 0x1ff) << 0x10);
  aVar18 = (ctx->reg).sharp.reg13;
  (ctx->reg).sharp.reg13 =
       (anon_struct_4_3_f795cdea_for_reg13)((uint)aVar18 & 0xfffffe00 | local_d8[0] & 0x1ff);
  (ctx->reg).sharp.reg13 =
       (anon_struct_4_3_f795cdea_for_reg13)
       ((uint)aVar18 & 0xfe00fe00 | local_d8[0] & 0x1ff | (local_118[0] & 0x1ff) << 0x10);
  aVar19 = (ctx->reg).sharp.reg14;
  (ctx->reg).sharp.reg14 =
       (anon_struct_4_3_f795d56a_for_reg14)((uint)aVar19 & 0xfffffe00 | local_2e8 & 0x1ff);
  (ctx->reg).sharp.reg14 =
       (anon_struct_4_3_f795d56a_for_reg14)
       ((uint)aVar19 & 0xfe00fe00 | local_2e8 & 0x1ff | (local_78[0] & 0x1ff) << 0x10);
  aVar20 = (ctx->reg).sharp.reg15;
  (ctx->reg).sharp.reg15 =
       (anon_struct_4_3_f795d5aa_for_reg15)((uint)aVar20 & 0xfffffe00 | local_b8[0] & 0x1ff);
  (ctx->reg).sharp.reg15 =
       (anon_struct_4_3_f795d5aa_for_reg15)
       ((uint)aVar20 & 0xfe00fe00 | local_b8[0] & 0x1ff | (local_f8[0] & 0x1ff) << 0x10);
  aVar21 = (ctx->reg).sharp.reg16;
  (ctx->reg).sharp.reg16 =
       (anon_struct_4_3_c249374a_for_reg16)((uint)aVar21 & 0xfffffe00 | local_138[0] & 0x1ff);
  (ctx->reg).sharp.reg16 =
       (anon_struct_4_3_c249374a_for_reg16)
       ((uint)aVar21 & 0xfe00fe00 | local_138[0] & 0x1ff | (local_158[0] & 0x1ff) << 0x10);
  aVar22 = (ctx->reg).sharp.reg17;
  (ctx->reg).sharp.reg17 =
       (anon_struct_4_3_c24937c5_for_reg17)((uint)aVar22 & 0xfffffe00 | local_178[0] & 0x1ff);
  (ctx->reg).sharp.reg17 =
       (anon_struct_4_3_c24937c5_for_reg17)
       ((uint)aVar22 & 0xfe00fe00 | local_178[0] & 0x1ff | (local_198[0] & 0x1ff) << 0x10);
  aVar23 = (ctx->reg).sharp.reg18;
  (ctx->reg).sharp.reg18 =
       (anon_struct_4_3_c2493f2a_for_reg18)((uint)aVar23 & 0xfffffe00 | local_1b8[0] & 0x1ff);
  (ctx->reg).sharp.reg18 =
       (anon_struct_4_3_c2493f2a_for_reg18)
       ((uint)aVar23 & 0xfe00fe00 | local_1b8[0] & 0x1ff | (local_1d8[0] & 0x1ff) << 0x10);
  aVar24 = (ctx->reg).sharp.reg19;
  (ctx->reg).sharp.reg19 =
       (anon_struct_4_3_a38c4f29_for_reg19)((uint)aVar24 & 0xfffff000 | local_258[0] & 0xfff);
  (ctx->reg).sharp.reg19 =
       (anon_struct_4_3_a38c4f29_for_reg19)
       ((uint)aVar24 & 0xf000f000 | local_258[0] & 0xfff | (local_278[0] & 0xfff) << 0x10);
  aVar25 = (ctx->reg).sharp.reg20;
  (ctx->reg).sharp.reg20 =
       (anon_struct_4_3_a38c5e4b_for_reg20)((uint)aVar25 & 0xfffff000 | local_298[0] & 0xfff);
  (ctx->reg).sharp.reg20 =
       (anon_struct_4_3_a38c5e4b_for_reg20)
       ((uint)aVar25 & 0xf000f000 | local_298[0] & 0xfff | (local_1f8[0] & 0xfff) << 0x10);
  aVar26 = (ctx->reg).sharp.reg21;
  (ctx->reg).sharp.reg21 =
       (anon_struct_4_2_eef66cc1_for_reg21)((uint)aVar26 & 0xfffff000 | local_218[0] & 0xfff);
  (ctx->reg).sharp.reg21 =
       (anon_struct_4_2_eef66cc1_for_reg21)
       ((uint)aVar26 & 0xff000000 | local_218[0] & 0xfff | (local_238[0] & 0xfff) << 0xc);
  aVar27 = (ctx->reg).sharp.reg23;
  (ctx->reg).sharp.reg23 =
       (anon_struct_4_3_f3bb698a_for_reg23)((uint)aVar27 & 0xfffffe00 | local_58[1] & 0x1ff);
  (ctx->reg).sharp.reg23 =
       (anon_struct_4_3_f3bb698a_for_reg23)
       ((uint)aVar27 & 0xfe00fe00 | local_58[1] & 0x1ff | (local_98[1] & 0x1ff) << 0x10);
  aVar28 = (ctx->reg).sharp.reg24;
  (ctx->reg).sharp.reg24 =
       (anon_struct_4_3_f3bb69ca_for_reg24)((uint)aVar28 & 0xfffffe00 | local_d8[1] & 0x1ff);
  (ctx->reg).sharp.reg24 =
       (anon_struct_4_3_f3bb69ca_for_reg24)
       ((uint)aVar28 & 0xfe00fe00 | local_d8[1] & 0x1ff | (local_118[1] & 0x1ff) << 0x10);
  aVar29 = (ctx->reg).sharp.reg25;
  (ctx->reg).sharp.reg25 =
       (anon_struct_4_3_f3bb714a_for_reg25)((uint)aVar29 & 0xfffffe00 | uStack_2e4 & 0x1ff);
  (ctx->reg).sharp.reg25 =
       (anon_struct_4_3_f3bb714a_for_reg25)
       ((uint)aVar29 & 0xfe00fe00 | uStack_2e4 & 0x1ff | (local_78[1] & 0x1ff) << 0x10);
  aVar30 = (ctx->reg).sharp.reg26;
  (ctx->reg).sharp.reg26 =
       (anon_struct_4_3_f3bb718a_for_reg26)((uint)aVar30 & 0xfffffe00 | local_b8[1] & 0x1ff);
  (ctx->reg).sharp.reg26 =
       (anon_struct_4_3_f3bb718a_for_reg26)
       ((uint)aVar30 & 0xfe00fe00 | local_b8[1] & 0x1ff | (local_f8[1] & 0x1ff) << 0x10);
  aVar31 = (ctx->reg).sharp.reg27;
  (ctx->reg).sharp.reg27 =
       (anon_struct_4_3_4b775b2a_for_reg27)((uint)aVar31 & 0xfffffe00 | local_138[1] & 0x1ff);
  (ctx->reg).sharp.reg27 =
       (anon_struct_4_3_4b775b2a_for_reg27)
       ((uint)aVar31 & 0xfe00fe00 | local_138[1] & 0x1ff | (local_158[1] & 0x1ff) << 0x10);
  aVar32 = (ctx->reg).sharp.reg28;
  (ctx->reg).sharp.reg28 =
       (anon_struct_4_3_4b775ba5_for_reg28)((uint)aVar32 & 0xfffffe00 | local_178[1] & 0x1ff);
  (ctx->reg).sharp.reg28 =
       (anon_struct_4_3_4b775ba5_for_reg28)
       ((uint)aVar32 & 0xfe00fe00 | local_178[1] & 0x1ff | (local_198[1] & 0x1ff) << 0x10);
  aVar33 = (ctx->reg).sharp.reg29;
  (ctx->reg).sharp.reg29 =
       (anon_struct_4_3_4b77630a_for_reg29)((uint)aVar33 & 0xfffffe00 | local_1b8[1] & 0x1ff);
  (ctx->reg).sharp.reg29 =
       (anon_struct_4_3_4b77630a_for_reg29)
       ((uint)aVar33 & 0xfe00fe00 | local_1b8[1] & 0x1ff | (local_1d8[1] & 0x1ff) << 0x10);
  aVar34 = (ctx->reg).sharp.reg30;
  (ctx->reg).sharp.reg30 =
       (anon_struct_4_3_4022a749_for_reg30)((uint)aVar34 & 0xfffff000 | local_258[1] & 0xfff);
  (ctx->reg).sharp.reg30 =
       (anon_struct_4_3_4022a749_for_reg30)
       ((uint)aVar34 & 0xf000f000 | local_258[1] & 0xfff | (local_278[1] & 0xfff) << 0x10);
  aVar35 = (ctx->reg).sharp.reg31;
  (ctx->reg).sharp.reg31 =
       (anon_struct_4_3_4022b66b_for_reg31)((uint)aVar35 & 0xfffff000 | local_298[1] & 0xfff);
  (ctx->reg).sharp.reg31 =
       (anon_struct_4_3_4022b66b_for_reg31)
       ((uint)aVar35 & 0xf000f000 | local_298[1] & 0xfff | (local_1f8[1] & 0xfff) << 0x10);
  aVar36 = (ctx->reg).sharp.reg32;
  (ctx->reg).sharp.reg32 =
       (anon_struct_4_2_8b8cc4e1_for_reg32)((uint)aVar36 & 0xfffff000 | local_218[1] & 0xfff);
  (ctx->reg).sharp.reg32 =
       (anon_struct_4_2_8b8cc4e1_for_reg32)
       ((uint)aVar36 & 0xff000000 | local_218[1] & 0xfff | (local_238[1] & 0xfff) << 0xc);
  aVar37 = (ctx->reg).sharp.reg34;
  (ctx->reg).sharp.reg34 =
       (anon_struct_4_3_efe1056a_for_reg34)((uint)aVar37 & 0xfffffe00 | local_58[2] & 0x1ff);
  (ctx->reg).sharp.reg34 =
       (anon_struct_4_3_efe1056a_for_reg34)
       ((uint)aVar37 & 0xfe00fe00 | local_58[2] & 0x1ff | (local_98[2] & 0x1ff) << 0x10);
  aVar38 = (ctx->reg).sharp.reg35;
  (ctx->reg).sharp.reg35 =
       (anon_struct_4_3_efe105aa_for_reg35)((uint)aVar38 & 0xfffffe00 | local_d8[2] & 0x1ff);
  (ctx->reg).sharp.reg35 =
       (anon_struct_4_3_efe105aa_for_reg35)
       ((uint)aVar38 & 0xfe00fe00 | local_d8[2] & 0x1ff | (local_118[2] & 0x1ff) << 0x10);
  aVar39 = (ctx->reg).sharp.reg36;
  (ctx->reg).sharp.reg36 =
       (anon_struct_4_3_efe10d2a_for_reg36)((uint)aVar39 & 0xfffffe00 | uStack_2e0 & 0x1ff);
  (ctx->reg).sharp.reg36 =
       (anon_struct_4_3_efe10d2a_for_reg36)
       ((uint)aVar39 & 0xfe00fe00 | uStack_2e0 & 0x1ff | (local_78[2] & 0x1ff) << 0x10);
  aVar40 = (ctx->reg).sharp.reg37;
  (ctx->reg).sharp.reg37 =
       (anon_struct_4_3_efe10d6a_for_reg37)((uint)aVar40 & 0xfffffe00 | local_b8[2] & 0x1ff);
  (ctx->reg).sharp.reg37 =
       (anon_struct_4_3_efe10d6a_for_reg37)
       ((uint)aVar40 & 0xfe00fe00 | local_b8[2] & 0x1ff | (local_f8[2] & 0x1ff) << 0x10);
  aVar41 = (ctx->reg).sharp.reg38;
  (ctx->reg).sharp.reg38 =
       (anon_struct_4_3_d4a57f0a_for_reg38)((uint)aVar41 & 0xfffffe00 | local_138[2] & 0x1ff);
  (ctx->reg).sharp.reg38 =
       (anon_struct_4_3_d4a57f0a_for_reg38)
       ((uint)aVar41 & 0xfe00fe00 | local_138[2] & 0x1ff | (local_158[2] & 0x1ff) << 0x10);
  aVar42 = (ctx->reg).sharp.reg39;
  (ctx->reg).sharp.reg39 =
       (anon_struct_4_3_d4a57f85_for_reg39)((uint)aVar42 & 0xfffffe00 | local_178[2] & 0x1ff);
  (ctx->reg).sharp.reg39 =
       (anon_struct_4_3_d4a57f85_for_reg39)
       ((uint)aVar42 & 0xfe00fe00 | local_178[2] & 0x1ff | (local_198[2] & 0x1ff) << 0x10);
  aVar43 = (ctx->reg).sharp.reg40;
  (ctx->reg).sharp.reg40 =
       (anon_struct_4_3_d4a586ea_for_reg40)((uint)aVar43 & 0xfffffe00 | local_1b8[2] & 0x1ff);
  (ctx->reg).sharp.reg40 =
       (anon_struct_4_3_d4a586ea_for_reg40)
       ((uint)aVar43 & 0xfe00fe00 | local_1b8[2] & 0x1ff | (local_1d8[2] & 0x1ff) << 0x10);
  aVar44 = (ctx->reg).sharp.reg41;
  (ctx->reg).sharp.reg41 =
       (anon_struct_4_3_dcb8ff69_for_reg41)((uint)aVar44 & 0xfffff000 | local_258[2] & 0xfff);
  (ctx->reg).sharp.reg41 =
       (anon_struct_4_3_dcb8ff69_for_reg41)
       ((uint)aVar44 & 0xf000f000 | local_258[2] & 0xfff | (local_278[2] & 0xfff) << 0x10);
  aVar45 = (ctx->reg).sharp.reg42;
  (ctx->reg).sharp.reg42 =
       (anon_struct_4_3_dcb90e8b_for_reg42)((uint)aVar45 & 0xfffff000 | local_298[2] & 0xfff);
  (ctx->reg).sharp.reg42 =
       (anon_struct_4_3_dcb90e8b_for_reg42)
       ((uint)aVar45 & 0xf000f000 | local_298[2] & 0xfff | (local_1f8[2] & 0xfff) << 0x10);
  aVar46 = (ctx->reg).sharp.reg43;
  (ctx->reg).sharp.reg43 =
       (anon_struct_4_2_28231d01_for_reg43)((uint)aVar46 & 0xfffff000 | local_218[2] & 0xfff);
  (ctx->reg).sharp.reg43 =
       (anon_struct_4_2_28231d01_for_reg43)
       ((uint)aVar46 & 0xff000000 | local_218[2] & 0xfff | (local_238[2] & 0xfff) << 0xc);
  aVar47 = (ctx->reg).sharp.reg45;
  (ctx->reg).sharp.reg45 =
       (anon_struct_4_3_ec06a14a_for_reg45)((uint)aVar47 & 0xfffffe00 | local_58[3] & 0x1ff);
  (ctx->reg).sharp.reg45 =
       (anon_struct_4_3_ec06a14a_for_reg45)
       ((uint)aVar47 & 0xfe00fe00 | local_58[3] & 0x1ff | (local_98[3] & 0x1ff) << 0x10);
  aVar48 = (ctx->reg).sharp.reg46;
  (ctx->reg).sharp.reg46 =
       (anon_struct_4_3_ec06a18a_for_reg46)((uint)aVar48 & 0xfffffe00 | local_d8[3] & 0x1ff);
  (ctx->reg).sharp.reg46 =
       (anon_struct_4_3_ec06a18a_for_reg46)
       ((uint)aVar48 & 0xfe00fe00 | local_d8[3] & 0x1ff | (local_118[3] & 0x1ff) << 0x10);
  aVar49 = (ctx->reg).sharp.reg47;
  (ctx->reg).sharp.reg47 =
       (anon_struct_4_3_ec06a90a_for_reg47)((uint)aVar49 & 0xfffffe00 | uStack_2dc & 0x1ff);
  (ctx->reg).sharp.reg47 =
       (anon_struct_4_3_ec06a90a_for_reg47)
       ((uint)aVar49 & 0xfe00fe00 | uStack_2dc & 0x1ff | (local_78[3] & 0x1ff) << 0x10);
  aVar50 = (ctx->reg).sharp.reg48;
  (ctx->reg).sharp.reg48 =
       (anon_struct_4_3_ec06a94a_for_reg48)((uint)aVar50 & 0xfffffe00 | local_b8[3] & 0x1ff);
  (ctx->reg).sharp.reg48 =
       (anon_struct_4_3_ec06a94a_for_reg48)
       ((uint)aVar50 & 0xfe00fe00 | local_b8[3] & 0x1ff | (local_f8[3] & 0x1ff) << 0x10);
  aVar51 = (ctx->reg).sharp.reg49;
  (ctx->reg).sharp.reg49 =
       (anon_struct_4_3_5dd3a2ea_for_reg49)((uint)aVar51 & 0xfffffe00 | local_138[3] & 0x1ff);
  (ctx->reg).sharp.reg49 =
       (anon_struct_4_3_5dd3a2ea_for_reg49)
       ((uint)aVar51 & 0xfe00fe00 | local_138[3] & 0x1ff | (local_158[3] & 0x1ff) << 0x10);
  aVar52 = (ctx->reg).sharp.reg50;
  (ctx->reg).sharp.reg50 =
       (anon_struct_4_3_5dd3a365_for_reg50)((uint)aVar52 & 0xfffffe00 | local_178[3] & 0x1ff);
  (ctx->reg).sharp.reg50 =
       (anon_struct_4_3_5dd3a365_for_reg50)
       ((uint)aVar52 & 0xfe00fe00 | local_178[3] & 0x1ff | (local_198[3] & 0x1ff) << 0x10);
  aVar53 = (ctx->reg).sharp.reg51;
  (ctx->reg).sharp.reg51 =
       (anon_struct_4_3_5dd3aaca_for_reg51)((uint)aVar53 & 0xfffffe00 | local_1b8[3] & 0x1ff);
  (ctx->reg).sharp.reg51 =
       (anon_struct_4_3_5dd3aaca_for_reg51)
       ((uint)aVar53 & 0xfe00fe00 | local_1b8[3] & 0x1ff | (local_1d8[3] & 0x1ff) << 0x10);
  aVar54 = (ctx->reg).sharp.reg52;
  (ctx->reg).sharp.reg52 =
       (anon_struct_4_3_794f5789_for_reg52)((uint)aVar54 & 0xfffff000 | local_258[3] & 0xfff);
  (ctx->reg).sharp.reg52 =
       (anon_struct_4_3_794f5789_for_reg52)
       ((uint)aVar54 & 0xf000f000 | local_258[3] & 0xfff | (local_278[3] & 0xfff) << 0x10);
  aVar55 = (ctx->reg).sharp.reg53;
  (ctx->reg).sharp.reg53 =
       (anon_struct_4_3_794f66ab_for_reg53)((uint)aVar55 & 0xfffff000 | local_298[3] & 0xfff);
  (ctx->reg).sharp.reg53 =
       (anon_struct_4_3_794f66ab_for_reg53)
       ((uint)aVar55 & 0xf000f000 | local_298[3] & 0xfff | (local_1f8[3] & 0xfff) << 0x10);
  aVar56 = (ctx->reg).sharp.reg54;
  (ctx->reg).sharp.reg54 =
       (anon_struct_4_2_c4b97521_for_reg54)((uint)aVar56 & 0xfffff000 | local_218[3] & 0xfff);
  (ctx->reg).sharp.reg54 =
       (anon_struct_4_2_c4b97521_for_reg54)
       ((uint)aVar56 & 0xff000000 | local_218[3] & 0xfff | (local_238[3] & 0xfff) << 0xc);
  aVar57 = (ctx->reg).sharp.reg56;
  (ctx->reg).sharp.reg56 =
       (anon_struct_4_3_e82c3d2a_for_reg56)((uint)aVar57 & 0xfffffe00 | local_58[4] & 0x1ff);
  (ctx->reg).sharp.reg56 =
       (anon_struct_4_3_e82c3d2a_for_reg56)
       ((uint)aVar57 & 0xfe00fe00 | local_58[4] & 0x1ff | (local_98[4] & 0x1ff) << 0x10);
  aVar58 = (ctx->reg).sharp.reg57;
  (ctx->reg).sharp.reg57 =
       (anon_struct_4_3_e82c3d6a_for_reg57)((uint)aVar58 & 0xfffffe00 | local_d8[4] & 0x1ff);
  (ctx->reg).sharp.reg57 =
       (anon_struct_4_3_e82c3d6a_for_reg57)
       ((uint)aVar58 & 0xfe00fe00 | local_d8[4] & 0x1ff | (local_118[4] & 0x1ff) << 0x10);
  aVar59 = (ctx->reg).sharp.reg58;
  (ctx->reg).sharp.reg58 =
       (anon_struct_4_3_e82c44ea_for_reg58)((uint)aVar59 & 0xfffffe00 | uStack_2d8 & 0x1ff);
  (ctx->reg).sharp.reg58 =
       (anon_struct_4_3_e82c44ea_for_reg58)
       ((uint)aVar59 & 0xfe00fe00 | uStack_2d8 & 0x1ff | (local_78[4] & 0x1ff) << 0x10);
  aVar60 = (ctx->reg).sharp.reg59;
  (ctx->reg).sharp.reg59 =
       (anon_struct_4_3_e82c452a_for_reg59)((uint)aVar60 & 0xfffffe00 | local_b8[4] & 0x1ff);
  (ctx->reg).sharp.reg59 =
       (anon_struct_4_3_e82c452a_for_reg59)
       ((uint)aVar60 & 0xfe00fe00 | local_b8[4] & 0x1ff | (local_f8[4] & 0x1ff) << 0x10);
  aVar61 = (ctx->reg).sharp.reg60;
  (ctx->reg).sharp.reg60 =
       (anon_struct_4_3_e701c6ca_for_reg60)((uint)aVar61 & 0xfffffe00 | local_138[4] & 0x1ff);
  (ctx->reg).sharp.reg60 =
       (anon_struct_4_3_e701c6ca_for_reg60)
       ((uint)aVar61 & 0xfe00fe00 | local_138[4] & 0x1ff | (local_158[4] & 0x1ff) << 0x10);
  aVar62 = (ctx->reg).sharp.reg61;
  (ctx->reg).sharp.reg61 =
       (anon_struct_4_3_e701c745_for_reg61)((uint)aVar62 & 0xfffffe00 | local_178[4] & 0x1ff);
  (ctx->reg).sharp.reg61 =
       (anon_struct_4_3_e701c745_for_reg61)
       ((uint)aVar62 & 0xfe00fe00 | local_178[4] & 0x1ff | (local_198[4] & 0x1ff) << 0x10);
  aVar63 = (ctx->reg).sharp.reg62;
  (ctx->reg).sharp.reg62 =
       (anon_struct_4_3_e701ceaa_for_reg62)((uint)aVar63 & 0xfffffe00 | local_1b8[4] & 0x1ff);
  (ctx->reg).sharp.reg62 =
       (anon_struct_4_3_e701ceaa_for_reg62)
       ((uint)aVar63 & 0xfe00fe00 | local_1b8[4] & 0x1ff | (local_1d8[4] & 0x1ff) << 0x10);
  aVar64 = (ctx->reg).sharp.reg63;
  (ctx->reg).sharp.reg63 =
       (anon_struct_4_3_15e5afa9_for_reg63)((uint)aVar64 & 0xfffff000 | local_258[4] & 0xfff);
  (ctx->reg).sharp.reg63 =
       (anon_struct_4_3_15e5afa9_for_reg63)
       ((uint)aVar64 & 0xf000f000 | local_258[4] & 0xfff | (local_278[4] & 0xfff) << 0x10);
  aVar65 = (ctx->reg).sharp.reg64;
  (ctx->reg).sharp.reg64 =
       (anon_struct_4_3_15e5becb_for_reg64)((uint)aVar65 & 0xfffff000 | local_298[4] & 0xfff);
  (ctx->reg).sharp.reg64 =
       (anon_struct_4_3_15e5becb_for_reg64)
       ((uint)aVar65 & 0xf000f000 | local_298[4] & 0xfff | (local_1f8[4] & 0xfff) << 0x10);
  aVar66 = (ctx->reg).sharp.reg65;
  (ctx->reg).sharp.reg65 =
       (anon_struct_4_2_614fcd41_for_reg65)((uint)aVar66 & 0xfffff000 | local_218[4] & 0xfff);
  (ctx->reg).sharp.reg65 =
       (anon_struct_4_2_614fcd41_for_reg65)
       ((uint)aVar66 & 0xff000000 | local_218[4] & 0xfff | (local_238[4] & 0xfff) << 0xc);
  aVar67 = (ctx->reg).sharp.reg67;
  (ctx->reg).sharp.reg67 =
       (anon_struct_4_3_e451d90a_for_reg67)((uint)aVar67 & 0xfffffe00 | local_58[5] & 0x1ff);
  (ctx->reg).sharp.reg67 =
       (anon_struct_4_3_e451d90a_for_reg67)
       ((uint)aVar67 & 0xfe00fe00 | local_58[5] & 0x1ff | (local_98[5] & 0x1ff) << 0x10);
  aVar68 = (ctx->reg).sharp.reg68;
  (ctx->reg).sharp.reg68 =
       (anon_struct_4_3_e451d94a_for_reg68)((uint)aVar68 & 0xfffffe00 | local_d8[5] & 0x1ff);
  (ctx->reg).sharp.reg68 =
       (anon_struct_4_3_e451d94a_for_reg68)
       ((uint)aVar68 & 0xfe00fe00 | local_d8[5] & 0x1ff | (local_118[5] & 0x1ff) << 0x10);
  aVar69 = (ctx->reg).sharp.reg69;
  (ctx->reg).sharp.reg69 =
       (anon_struct_4_3_e451e0ca_for_reg69)((uint)aVar69 & 0xfffffe00 | (uint)uStack_2d4 & 0x1ff);
  (ctx->reg).sharp.reg69 =
       (anon_struct_4_3_e451e0ca_for_reg69)
       ((uint)aVar69 & 0xfe00fe00 | (uint)uStack_2d4 & 0x1ff | (local_78[5] & 0x1ff) << 0x10);
  aVar70 = (ctx->reg).sharp.reg70;
  (ctx->reg).sharp.reg70 =
       (anon_struct_4_3_e451e10a_for_reg70)((uint)aVar70 & 0xfffffe00 | local_b8[5] & 0x1ff);
  (ctx->reg).sharp.reg70 =
       (anon_struct_4_3_e451e10a_for_reg70)
       ((uint)aVar70 & 0xfe00fe00 | local_b8[5] & 0x1ff | (local_f8[5] & 0x1ff) << 0x10);
  aVar71 = (ctx->reg).sharp.reg71;
  (ctx->reg).sharp.reg71 =
       (anon_struct_4_3_702feaaa_for_reg71)((uint)aVar71 & 0xfffffe00 | local_138[5] & 0x1ff);
  (ctx->reg).sharp.reg71 =
       (anon_struct_4_3_702feaaa_for_reg71)
       ((uint)aVar71 & 0xfe00fe00 | local_138[5] & 0x1ff | (local_158[5] & 0x1ff) << 0x10);
  aVar72 = (ctx->reg).sharp.reg72;
  (ctx->reg).sharp.reg72 =
       (anon_struct_4_3_702feb25_for_reg72)((uint)aVar72 & 0xfffffe00 | local_178[5] & 0x1ff);
  (ctx->reg).sharp.reg72 =
       (anon_struct_4_3_702feb25_for_reg72)
       ((uint)aVar72 & 0xfe00fe00 | local_178[5] & 0x1ff | (local_198[5] & 0x1ff) << 0x10);
  aVar73 = (ctx->reg).sharp.reg73;
  (ctx->reg).sharp.reg73 =
       (anon_struct_4_3_702ff28a_for_reg73)((uint)aVar73 & 0xfffffe00 | local_1b8[5] & 0x1ff);
  (ctx->reg).sharp.reg73 =
       (anon_struct_4_3_702ff28a_for_reg73)
       ((uint)aVar73 & 0xfe00fe00 | local_1b8[5] & 0x1ff | (local_1d8[5] & 0x1ff) << 0x10);
  aVar74 = (ctx->reg).sharp.reg74;
  (ctx->reg).sharp.reg74 =
       (anon_struct_4_3_b27c07c9_for_reg74)((uint)aVar74 & 0xfffff000 | local_258[5] & 0xfff);
  (ctx->reg).sharp.reg74 =
       (anon_struct_4_3_b27c07c9_for_reg74)
       ((uint)aVar74 & 0xf000f000 | local_258[5] & 0xfff | (local_278[5] & 0xfff) << 0x10);
  aVar75 = (ctx->reg).sharp.reg75;
  (ctx->reg).sharp.reg75 =
       (anon_struct_4_3_b27c16eb_for_reg75)((uint)aVar75 & 0xfffff000 | local_298[5] & 0xfff);
  (ctx->reg).sharp.reg75 =
       (anon_struct_4_3_b27c16eb_for_reg75)
       ((uint)aVar75 & 0xf000f000 | local_298[5] & 0xfff | (local_1f8[5] & 0xfff) << 0x10);
  aVar76 = (ctx->reg).sharp.reg76;
  (ctx->reg).sharp.reg76 =
       (anon_struct_4_2_fde62561_for_reg76)((uint)aVar76 & 0xfffff000 | local_218[5] & 0xfff);
  (ctx->reg).sharp.reg76 =
       (anon_struct_4_2_fde62561_for_reg76)
       ((uint)aVar76 & 0xff000000 | local_218[5] & 0xfff | (local_238[5] & 0xfff) << 0xc);
  aVar77 = (ctx->reg).sharp.reg78;
  (ctx->reg).sharp.reg78 =
       (anon_struct_4_3_e07774ea_for_reg78)((uint)aVar77 & 0xfffff000 | local_58[6] & 0xfff);
  (ctx->reg).sharp.reg78 =
       (anon_struct_4_3_e07774ea_for_reg78)
       ((uint)aVar77 & 0xf000f000 | local_58[6] & 0xfff | (local_98[6] & 0xfff) << 0x10);
  aVar78 = (ctx->reg).sharp.reg79;
  (ctx->reg).sharp.reg79 =
       (anon_struct_4_3_e077752a_for_reg79)((uint)aVar78 & 0xfffffe00 | local_d8[6] & 0x1ff);
  (ctx->reg).sharp.reg79 =
       (anon_struct_4_3_e077752a_for_reg79)
       ((uint)aVar78 & 0xfe00fe00 | local_d8[6] & 0x1ff | (local_118[6] & 0x1ff) << 0x10);
  aVar79 = (ctx->reg).sharp.reg80;
  (ctx->reg).sharp.reg80 =
       (anon_struct_4_3_e0777caa_for_reg80)((uint)aVar79 & 0xfffffe00 | uStack_2d4._4_4_ & 0x1ff);
  (ctx->reg).sharp.reg80 =
       (anon_struct_4_3_e0777caa_for_reg80)
       ((uint)aVar79 & 0xfe00fe00 | uStack_2d4._4_4_ & 0x1ff | (local_78[6] & 0x1ff) << 0x10);
  aVar80 = (ctx->reg).sharp.reg81;
  (ctx->reg).sharp.reg81 =
       (anon_struct_4_3_e0777cea_for_reg81)((uint)aVar80 & 0xfffffe00 | local_b8[6] & 0x1ff);
  (ctx->reg).sharp.reg81 =
       (anon_struct_4_3_e0777cea_for_reg81)
       ((uint)aVar80 & 0xfe00fe00 | local_b8[6] & 0x1ff | (local_f8[6] & 0x1ff) << 0x10);
  aVar81 = (ctx->reg).sharp.reg82;
  (ctx->reg).sharp.reg82 =
       (anon_struct_4_3_f95e0e8a_for_reg82)((uint)aVar81 & 0xfffffe00 | local_138[6] & 0x1ff);
  (ctx->reg).sharp.reg82 =
       (anon_struct_4_3_f95e0e8a_for_reg82)
       ((uint)aVar81 & 0xfe00fe00 | local_138[6] & 0x1ff | (local_158[6] & 0x1ff) << 0x10);
  aVar82 = (ctx->reg).sharp.reg83;
  (ctx->reg).sharp.reg83 =
       (anon_struct_4_3_f95e0f05_for_reg83)((uint)aVar82 & 0xfffffe00 | local_178[6] & 0x1ff);
  (ctx->reg).sharp.reg83 =
       (anon_struct_4_3_f95e0f05_for_reg83)
       ((uint)aVar82 & 0xfe00fe00 | local_178[6] & 0x1ff | (local_198[6] & 0x1ff) << 0x10);
  aVar83 = (ctx->reg).sharp.reg84;
  (ctx->reg).sharp.reg84 =
       (anon_struct_4_3_f95e166a_for_reg84)((uint)aVar83 & 0xfffffe00 | local_1b8[6] & 0x1ff);
  (ctx->reg).sharp.reg84 =
       (anon_struct_4_3_f95e166a_for_reg84)
       ((uint)aVar83 & 0xfe00fe00 | local_1b8[6] & 0x1ff | (local_1d8[6] & 0x1ff) << 0x10);
  aVar84 = (ctx->reg).sharp.reg85;
  (ctx->reg).sharp.reg85 =
       (anon_struct_4_3_4f125fe9_for_reg85)((uint)aVar84 & 0xfffff000 | local_258[6] & 0xfff);
  (ctx->reg).sharp.reg85 =
       (anon_struct_4_3_4f125fe9_for_reg85)
       ((uint)aVar84 & 0xf000f000 | local_258[6] & 0xfff | (local_278[6] & 0xfff) << 0x10);
  aVar85 = (ctx->reg).sharp.reg86;
  (ctx->reg).sharp.reg86 =
       (anon_struct_4_3_4f126f0b_for_reg86)((uint)aVar85 & 0xfffff000 | local_298[6] & 0xfff);
  (ctx->reg).sharp.reg86 =
       (anon_struct_4_3_4f126f0b_for_reg86)
       ((uint)aVar85 & 0xf000f000 | local_298[6] & 0xfff | (local_1f8[6] & 0xfff) << 0x10);
  aVar86 = (ctx->reg).sharp.reg87;
  (ctx->reg).sharp.reg87 =
       (anon_struct_4_2_9a7c7d81_for_reg87)((uint)aVar86 & 0xfffff000 | local_218[6] & 0xfff);
  (ctx->reg).sharp.reg87 =
       (anon_struct_4_2_9a7c7d81_for_reg87)
       ((uint)aVar86 & 0xff000000 | local_218[6] & 0xfff | (local_238[6] & 0xfff) << 0xc);
  aVar87 = (ctx->reg).sharp.reg2;
  uVar150 = (src_params->shp_params).peaking_filt_core_V0[0] & 0xf;
  (ctx->reg).sharp.reg2 = (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar87 & 0xfffffff0 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_filt_core_V0[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar87 & 0xffffff00 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_filt_core_V0[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar87 & 0xfffff000 | uVar150 | uVar159 | uVar151);
  uVar145 = ((src_params->shp_params).peaking_filt_core_V1[0] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar87 & 0xffff0000 | uVar150 | uVar159 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).peaking_filt_core_V1[1] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar87 & 0xfff00000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155);
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar87 & 0xff000000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155 |
       ((src_params->shp_params).peaking_filt_core_V1[2] & 0xfU) << 0x14);
  aVar88 = (ctx->reg).sharp.reg3;
  uVar150 = (src_params->shp_params).peaking_filt_core_V2[0] & 0xf;
  (ctx->reg).sharp.reg3 = (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar88 & 0xfffffff0 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_filt_core_V2[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar88 & 0xffffff00 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_filt_core_V2[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar88 & 0xfffff000 | uVar150 | uVar159 | uVar151);
  uVar145 = ((src_params->shp_params).peaking_filt_core_USM[0] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar88 & 0xffff0000 | uVar150 | uVar159 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).peaking_filt_core_USM[1] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar88 & 0xfff00000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).peaking_filt_core_USM[2] & 0xfU) << 0x14;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar88 & 0xff000000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar88 & 0xf8000000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).peaking_filter_cfg_diag_enh_coef & 7U) << 0x18);
  aVar89 = (ctx->reg).sharp.reg4;
  uVar150 = (src_params->shp_params).peaking_filt_core_H0[0] & 0x3f;
  (ctx->reg).sharp.reg4 = (anon_struct_4_5_5206536f_for_reg4)((uint)aVar89 & 0xffffffc0 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_filt_core_H0[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg4 =
       (anon_struct_4_5_5206536f_for_reg4)((uint)aVar89 & 0xffffc0c0 | uVar150 | uVar159);
  (ctx->reg).sharp.reg4 =
       (anon_struct_4_5_5206536f_for_reg4)
       ((uint)aVar89 & 0xffc0c0c0 | uVar150 | uVar159 |
       ((src_params->shp_params).peaking_filt_core_H0[2] & 0x3fU) << 0x10);
  aVar90 = (ctx->reg).sharp.reg6;
  uVar150 = (src_params->shp_params).peaking_filt_core_H1[0] & 0x3f;
  (ctx->reg).sharp.reg6 = (anon_struct_4_5_5206cbae_for_reg6)((uint)aVar90 & 0xffffffc0 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_filt_core_H1[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg6 =
       (anon_struct_4_5_5206cbae_for_reg6)((uint)aVar90 & 0xffffc0c0 | uVar150 | uVar159);
  (ctx->reg).sharp.reg6 =
       (anon_struct_4_5_5206cbae_for_reg6)
       ((uint)aVar90 & 0xffc0c0c0 | uVar150 | uVar159 |
       ((src_params->shp_params).peaking_filt_core_H1[2] & 0x3fU) << 0x10);
  aVar91 = (ctx->reg).sharp.reg8;
  uVar150 = (src_params->shp_params).peaking_filt_core_H2[0] & 0x3f;
  (ctx->reg).sharp.reg8 = (anon_struct_4_5_520743ed_for_reg8)((uint)aVar91 & 0xffffffc0 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_filt_core_H2[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg8 =
       (anon_struct_4_5_520743ed_for_reg8)((uint)aVar91 & 0xffffc0c0 | uVar150 | uVar159);
  (ctx->reg).sharp.reg8 =
       (anon_struct_4_5_520743ed_for_reg8)
       ((uint)aVar91 & 0xffc0c0c0 | uVar150 | uVar159 |
       ((src_params->shp_params).peaking_filt_core_H2[2] & 0x3fU) << 0x10);
  uVar150 = (src_params->shp_params).peaking_gain & 0x3ff;
  aVar92 = (ctx->reg).sharp.reg100;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)((uint)aVar92 & 0xfffffc00 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_edge_ctrl_non_dir_thr & 0x7fU) << 0xc;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)((uint)aVar92 & 0xfff80c00 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_edge_ctrl_dir_cmp_ratio & 0xfU) << 0x14;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)
       ((uint)aVar92 & 0xff080c00 | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)
       ((uint)aVar92 & 0xe0080c00 | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).peaking_edge_ctrl_non_dir_wgt_ratio & 0x1fU) << 0x18);
  aVar129._1_3_ = SUB43((ctx->reg).sharp.reg101,1);
  aVar129._0_1_ = (char)(src_params->shp_params).peaking_edge_ctrl_non_dir_wgt_offset;
  (ctx->reg).sharp.reg101 = aVar129;
  uVar150 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_thr & 0xfU) << 8;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)((uint)aVar129 & 0xfffff0ff | uVar150);
  uVar159 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_avg & 7U) << 0xc;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)((uint)aVar129 & 0xffff80ff | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_offset & 0xfU) << 0x10;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)
       ((uint)aVar129 & 0xfff080ff | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)
       ((uint)aVar129 & 0xf80080ff | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).peaking_edge_ctrl_diag_dir_thr & 0x7fU) << 0x14);
  aVar93 = (ctx->reg).sharp.reg102;
  uVar150 = (src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[0] & 0xf;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)((uint)aVar93 & 0xfffffff0 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)((uint)aVar93 & 0xffffff00 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar93 & 0xfffff000 | uVar150 | uVar159 | uVar151);
  uVar145 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[3] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar93 & 0xffff0000 | uVar150 | uVar159 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[4] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar93 & 0xfff00000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[5] & 0xfU) << 0x14;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar93 & 0xff000000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155 | uVar156);
  uVar165 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[6] & 0xfU) << 0x18;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar93 & 0xf0000000 | uVar150 | uVar159 | uVar151 | uVar145 | uVar155 | uVar156 |
       uVar165);
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       (uVar150 | uVar159 | uVar151 | uVar145 | uVar155 | uVar156 | uVar165 |
       (src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[7] << 0x1c);
  aVar94 = (ctx->reg).sharp.reg103;
  uVar150 = (src_params->shp_params).peaking_estc_alpha_over_non & 0x7f;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)((uint)aVar94 & 0xffffff80 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_estc_alpha_under_non & 0x7fU) << 8;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)((uint)aVar94 & 0xffff8080 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_non & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)
       ((uint)aVar94 & 0xff808080 | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)
       ((uint)aVar94 & 0x80808080 | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_non & 0x7fU) << 0x18);
  aVar95 = (ctx->reg).sharp.reg104;
  uVar150 = (src_params->shp_params).peaking_estc_alpha_over_v & 0x7f;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)((uint)aVar95 & 0xffffff80 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_estc_alpha_under_v & 0x7fU) << 8;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)((uint)aVar95 & 0xffff8080 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_v & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)
       ((uint)aVar95 & 0xff808080 | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)
       ((uint)aVar95 & 0x80808080 | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_v & 0x7fU) << 0x18);
  aVar96 = (ctx->reg).sharp.reg105;
  uVar150 = (src_params->shp_params).peaking_estc_alpha_over_h & 0x7f;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)((uint)aVar96 & 0xffffff80 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_estc_alpha_under_h & 0x7fU) << 8;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)((uint)aVar96 & 0xffff8080 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_h & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)
       ((uint)aVar96 & 0xff808080 | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)
       ((uint)aVar96 & 0x80808080 | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_h & 0x7fU) << 0x18);
  aVar97 = (ctx->reg).sharp.reg106;
  uVar150 = (src_params->shp_params).peaking_estc_alpha_over_d0 & 0x7f;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)((uint)aVar97 & 0xffffff80 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_estc_alpha_under_d0 & 0x7fU) << 8;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)((uint)aVar97 & 0xffff8080 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_d0 & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)
       ((uint)aVar97 & 0xff808080 | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)
       ((uint)aVar97 & 0x80808080 | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_d0 & 0x7fU) << 0x18);
  aVar98 = (ctx->reg).sharp.reg107;
  uVar150 = (src_params->shp_params).peaking_estc_alpha_over_d1 & 0x7f;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)((uint)aVar98 & 0xffffff80 | uVar150);
  uVar159 = ((src_params->shp_params).peaking_estc_alpha_under_d1 & 0x7fU) << 8;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)((uint)aVar98 & 0xffff8080 | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_d1 & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)
       ((uint)aVar98 & 0xff808080 | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)
       ((uint)aVar98 & 0x80808080 | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_d1 & 0x7fU) << 0x18);
  aVar130._1_3_ = SUB43((ctx->reg).sharp.reg108,1);
  aVar130._0_1_ = (char)(src_params->shp_params).peaking_estc_delta_offset_non;
  (ctx->reg).sharp.reg108 = aVar130;
  uVar150 = ((src_params->shp_params).peaking_estc_delta_offset_v & 0xffU) << 8;
  (ctx->reg).sharp.reg108 =
       (anon_struct_4_3_724851b1_for_reg108)((uint)aVar130 & 0xffff00ff | uVar150);
  (ctx->reg).sharp.reg108 =
       (anon_struct_4_3_724851b1_for_reg108)
       ((uint)aVar130 & 0xff0000ff | uVar150 |
       ((src_params->shp_params).peaking_estc_delta_offset_h & 0xffU) << 0x10);
  RVar99 = (src_params->shp_params).peaking_estc_delta_offset_d0;
  *(char *)&(ctx->reg).sharp.reg109 = (char)RVar99;
  *(ushort *)&(ctx->reg).sharp.reg109 =
       (ushort)((src_params->shp_params).peaking_estc_delta_offset_d1 << 8) | (ushort)RVar99 & 0xff;
  aVar100 = (ctx->reg).sharp.reg110;
  uVar150 = (src_params->shp_params).shootctrl_filter_radius & 1;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)((uint)aVar100 & 0xfffffffe | uVar150);
  uVar159 = ((src_params->shp_params).shootctrl_delta_offset & 0xffU) << 4;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)((uint)aVar100 & 0xfffff00e | uVar150 | uVar159);
  uVar151 = ((src_params->shp_params).shootctrl_alpha_over & 0x7fU) << 0xc;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)
       ((uint)aVar100 & 0xfff8000e | uVar150 | uVar159 | uVar151);
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)
       ((uint)aVar100 & 0xf808000e | uVar150 | uVar159 | uVar151 |
       ((src_params->shp_params).shootctrl_alpha_under & 0x7fU) << 0x14);
  uVar144 = (ushort)(src_params->shp_params).shootctrl_alpha_over_unlimit & 0x7f;
  uVar149 = SUB42((ctx->reg).sharp.reg111,0);
  *(ushort *)&(ctx->reg).sharp.reg111 = uVar149 & 0xff80 | uVar144;
  *(ushort *)&(ctx->reg).sharp.reg111 =
       uVar149 & 0x8080 | uVar144 |
       (ushort)(((src_params->shp_params).shootctrl_alpha_under_unlimit & 0x7fU) << 8);
  uVar169 = (uint)(src_params->shp_params).global_gain_adp_grd[1] >> 2 & 0xff;
  aVar101 = (ctx->reg).sharp.reg112;
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)((uint)aVar101 & 0xffffff00 | uVar169);
  uVar150 = (src_params->shp_params).global_gain_adp_grd[2];
  uVar151 = (uVar150 & 0x3fc) << 8;
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)((uint)aVar101 & 0xfffc0300 | uVar169 | uVar151);
  uVar159 = (src_params->shp_params).global_gain_adp_grd[3];
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)
       ((uint)aVar101 & 0xf00c0300 | uVar169 | uVar151 | (uVar159 & 0x3fc) << 0x12);
  uVar155 = (uint)(src_params->shp_params).global_gain_adp_grd[4] >> 2 & 0xff;
  aVar102 = (ctx->reg).sharp.reg113;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)((uint)aVar102 & 0xffffff00 | uVar155);
  uVar172 = (src_params->shp_params).global_gain_adp_val[0] & 0x7f;
  uVar151 = uVar172 << 0xc;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)((uint)aVar102 & 0xfff80f00 | uVar155 | uVar151);
  uVar145 = (src_params->shp_params).global_gain_adp_val[1] & 0x7f;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)
       ((uint)aVar102 & 0xf8080f00 | uVar155 | uVar151 | uVar145 << 0x14);
  uVar151 = (src_params->shp_params).global_gain_adp_val[2] & 0x7f;
  aVar103 = (ctx->reg).sharp.reg114;
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)((uint)aVar103 & 0xffffff80 | uVar151);
  uVar165 = (src_params->shp_params).global_gain_adp_val[3] & 0x7f;
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)((uint)aVar103 & 0xffff8080 | uVar151 | uVar165 << 8);
  uVar156 = (src_params->shp_params).global_gain_adp_val[4] & 0x7f;
  fVar177 = ((float)(int)(uVar145 - uVar172) * 128.0) / (float)(uVar169 + (uVar169 == 0));
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)
       ((uint)aVar103 & 0xff808080 | uVar151 | uVar165 << 8 | uVar156 << 0x10);
  uVar172 = 0x3fe00000;
  fVar137 = 0.5;
  if (fVar177 <= 0.0) {
    fVar137 = -0.5;
  }
  uVar150 = uVar150 >> 2 & 0xff;
  iVar157 = uVar150 - uVar169;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar180 = ((float)(int)(uVar151 - uVar145) * 128.0) / (float)iVar157;
  fVar138 = 0.5;
  if (fVar180 <= 0.0) {
    fVar138 = -0.5;
  }
  uVar159 = uVar159 >> 2 & 0xff;
  iVar157 = uVar159 - uVar150;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar178 = ((float)(int)(uVar165 - uVar151) * 128.0) / (float)iVar157;
  fVar139 = 0.5;
  if (fVar178 <= 0.0) {
    fVar139 = -0.5;
  }
  iVar157 = uVar155 - uVar159;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar181 = ((float)(int)(uVar156 - uVar165) * 128.0) / (float)iVar157;
  fVar140 = 0.5;
  if (fVar181 <= 0.0) {
    fVar140 = -0.5;
  }
  uVar150 = (uint)(fVar137 + fVar177);
  uVar145 = (uint)(fVar138 + fVar180);
  uVar159 = (uint)(fVar139 + fVar178);
  uVar151 = (uint)(fVar140 + fVar181);
  fVar177 = ((float)(int)((src_params->shp_params).global_gain_adp_val[5] - uVar156) * 128.0) /
            (float)((uVar155 ^ 0xff) + (uint)((uVar155 ^ 0xff) == 0));
  fVar137 = 0.5;
  if (fVar177 <= 0.0) {
    fVar137 = -0.5;
  }
  uVar155 = (uint)(fVar137 + fVar177);
  if (0x3fe < (int)uVar150) {
    uVar150 = 0x3ff;
  }
  if ((int)uVar150 < -0x3ff) {
    uVar150 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar145) {
    uVar145 = 0x3ff;
  }
  if ((int)uVar145 < -0x3ff) {
    uVar145 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar159) {
    uVar159 = 0x3ff;
  }
  if ((int)uVar159 < -0x3ff) {
    uVar159 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg115 =
       (anon_struct_4_3_f9f4ffc9_for_reg115)
       ((uVar145 & 0x7ff) << 0xc | (uint)(ctx->reg).sharp.reg115 & 0xff800800 | uVar150 & 0x7ff);
  if (0x3fe < (int)uVar151) {
    uVar151 = 0x3ff;
  }
  if ((int)uVar151 < -0x3ff) {
    uVar151 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg128 =
       (anon_struct_4_3_f9f507c9_for_reg128)
       ((uVar151 & 0x7ff) << 0xc | (uint)(ctx->reg).sharp.reg128 & 0xff800800 | uVar159 & 0x7ff);
  if (0x3fe < (int)uVar155) {
    uVar155 = 0x3ff;
  }
  if ((int)uVar155 < -0x3ff) {
    uVar155 = 0xfffffc00;
  }
  uVar155 = uVar155 & 0x7ff;
  aVar104 = (ctx->reg).sharp.reg129;
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)((uint)aVar104 & 0xfffff800 | uVar155);
  uVar150 = (src_params->shp_params).global_gain_var_grd[1];
  uVar151 = (uVar150 & 0x3fc) << 9;
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)((uint)aVar104 & 0xfff80000 | uVar155 | uVar151);
  uVar159 = (src_params->shp_params).global_gain_var_grd[2];
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)
       ((uint)aVar104 & 0xe0180000 | uVar155 | uVar151 | (uVar159 & 0x3fc) << 0x13);
  uVar155 = (uint)(src_params->shp_params).global_gain_var_grd[3] >> 2 & 0xff;
  aVar105 = (ctx->reg).sharp.reg130;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)((uint)aVar105 & 0xffffff00 | uVar155);
  uVar151 = (src_params->shp_params).global_gain_var_grd[4];
  uVar145 = (uVar151 & 0x3fc) << 10;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)((uint)aVar105 & 0xfff00f00 | uVar155 | uVar145);
  uVar165 = (src_params->shp_params).global_gain_var_val[0] & 0x7f;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)
       ((uint)aVar105 & 0x80f00f00 | uVar155 | uVar145 | uVar165 << 0x18);
  aVar106 = (ctx->reg).sharp.reg131;
  uVar145 = (src_params->shp_params).global_gain_var_val[1] & 0x7f;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)((uint)aVar106 & 0xffffff80 | uVar145);
  uVar173 = (src_params->shp_params).global_gain_var_val[2] & 0x7f;
  uVar167 = uVar173 << 8;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)((uint)aVar106 & 0xffff8080 | uVar145 | uVar167);
  uVar169 = (src_params->shp_params).global_gain_var_val[3] & 0x7f;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)
       ((uint)aVar106 & 0xff808080 | uVar145 | uVar167 | uVar169 << 0x10);
  uVar156 = (src_params->shp_params).global_gain_var_val[4] & 0x7f;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)
       ((uint)aVar106 & 0x80808080 | uVar145 | uVar167 | uVar169 << 0x10 | uVar156 << 0x18);
  uVar150 = uVar150 >> 2 & 0xff;
  fVar177 = ((float)(int)(uVar145 - uVar165) * 128.0) / (float)(uVar150 + (uVar150 == 0));
  fVar137 = 0.5;
  if (fVar177 <= 0.0) {
    fVar137 = -0.5;
  }
  uVar159 = uVar159 >> 2 & 0xff;
  iVar157 = uVar159 - uVar150;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar180 = ((float)(int)(uVar173 - uVar145) * 128.0) / (float)iVar157;
  fVar138 = 0.5;
  if (fVar180 <= 0.0) {
    fVar138 = -0.5;
  }
  iVar157 = uVar155 - uVar159;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar178 = ((float)(int)(uVar169 - uVar173) * 128.0) / (float)iVar157;
  fVar139 = 0.5;
  if (fVar178 <= 0.0) {
    fVar139 = -0.5;
  }
  uVar150 = uVar151 >> 2 & 0xff;
  iVar157 = uVar150 - uVar155;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar181 = ((float)(int)(uVar156 - uVar169) * 128.0) / (float)iVar157;
  fVar140 = 0.5;
  if (fVar181 <= 0.0) {
    fVar140 = -0.5;
  }
  uVar159 = (uint)(fVar177 + fVar137);
  uVar145 = (uint)(fVar138 + fVar180);
  uVar155 = (uint)(fVar139 + fVar178);
  uVar151 = (uint)(fVar140 + fVar181);
  uVar150 = uVar150 ^ 0xff;
  fVar177 = ((float)(int)((src_params->shp_params).global_gain_var_val[5] - uVar156) * 128.0) /
            (float)(uVar150 + (uVar150 == 0));
  fVar137 = 0.5;
  if (fVar177 <= 0.0) {
    fVar137 = -0.5;
  }
  uVar150 = (uint)(fVar137 + fVar177);
  if (0x3fe < (int)uVar159) {
    uVar159 = 0x3ff;
  }
  if ((int)uVar159 < -0x3ff) {
    uVar159 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar145) {
    uVar145 = 0x3ff;
  }
  if ((int)uVar145 < -0x3ff) {
    uVar145 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg132 =
       (anon_struct_4_3_72b65f09_for_reg132)
       ((uint)(ctx->reg).sharp.reg132 & 0xff800800 | uVar159 & 0x7ff | (uVar145 & 0x7ff) << 0xc);
  if (0x3fe < (int)uVar155) {
    uVar155 = 0x3ff;
  }
  if ((int)uVar155 < -0x3ff) {
    uVar155 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar151) {
    uVar151 = 0x3ff;
  }
  if ((int)uVar151 < -0x3ff) {
    uVar151 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg133 =
       (anon_struct_4_3_72b66709_for_reg133)
       ((uint)(ctx->reg).sharp.reg133 & 0xff800800 | uVar155 & 0x7ff | (uVar151 & 0x7ff) << 0xc);
  uVar159 = 0x3ff;
  if (0x3fe < (int)uVar150) {
    uVar150 = 0x3ff;
  }
  if ((int)uVar150 < -0x3ff) {
    uVar150 = 0xfffffc00;
  }
  uVar150 = uVar150 & 0x7ff;
  aVar107 = (ctx->reg).sharp.reg134;
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)((uint)aVar107 & 0xfffff800 | uVar150);
  uVar145 = ((src_params->shp_params).global_gain_lum_mode & 3U) << 0x10;
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)((uint)aVar107 & 0xfffcf800 | uVar150 | uVar145);
  uVar151 = (src_params->shp_params).global_gain_lum_grd[1];
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)
       ((uint)aVar107 & 0xf00cf800 | uVar150 | uVar145 | (uVar151 & 0x3fc) << 0x12);
  uVar165 = (uint)(src_params->shp_params).global_gain_lum_grd[2] >> 2 & 0xff;
  aVar108 = (ctx->reg).sharp.reg135;
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)((uint)aVar108 & 0xffffff00 | uVar165);
  uVar150 = (src_params->shp_params).global_gain_lum_grd[3];
  uVar155 = (uVar150 & 0x3fc) << 8;
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)((uint)aVar108 & 0xfffc0300 | uVar165 | uVar155);
  uVar145 = (src_params->shp_params).global_gain_lum_grd[4];
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)
       ((uint)aVar108 & 0xf00c0300 | uVar165 | uVar155 | (uVar145 & 0x3fc) << 0x12);
  aVar109 = (ctx->reg).sharp.reg136;
  uVar169 = (src_params->shp_params).global_gain_lum_val[0] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)((uint)aVar109 & 0xffffff80 | uVar169);
  uVar167 = (src_params->shp_params).global_gain_lum_val[1] & 0x7f;
  uVar155 = uVar167 << 8;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)((uint)aVar109 & 0xffff8080 | uVar169 | uVar155);
  uVar156 = (src_params->shp_params).global_gain_lum_val[2] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)
       ((uint)aVar109 & 0xff808080 | uVar169 | uVar155 | uVar156 << 0x10);
  uVar173 = (src_params->shp_params).global_gain_lum_val[3] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)
       ((uint)aVar109 & 0x80808080 | uVar169 | uVar155 | uVar156 << 0x10 | uVar173 << 0x18);
  aVar110 = (ctx->reg).sharp.reg137;
  uVar155 = (src_params->shp_params).global_gain_lum_val[4] & 0x7f;
  uVar151 = uVar151 >> 2 & 0xff;
  (ctx->reg).sharp.reg137 =
       (anon_struct_4_5_4b644edc_for_reg137)((uint)aVar110 & 0xffffff80 | uVar155);
  fVar177 = ((float)(int)(uVar167 - uVar169) * 128.0) / (float)(uVar151 + (uVar151 == 0));
  fVar137 = 0.5;
  if (fVar177 <= 0.0) {
    fVar137 = -0.5;
  }
  iVar157 = uVar165 - uVar151;
  if ((int)(uVar165 - uVar151) < 2) {
    iVar157 = 1;
  }
  fVar180 = ((float)(int)(uVar156 - uVar167) * 128.0) / (float)iVar157;
  fVar138 = 0.5;
  if (fVar180 <= 0.0) {
    fVar138 = -0.5;
  }
  uVar150 = uVar150 >> 2 & 0xff;
  iVar157 = uVar150 - uVar165;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar178 = ((float)(int)(uVar173 - uVar156) * 128.0) / (float)iVar157;
  fVar139 = 0.5;
  if (fVar178 <= 0.0) {
    fVar139 = -0.5;
  }
  uVar151 = uVar145 >> 2 & 0xff;
  iVar157 = uVar151 - uVar150;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar181 = ((float)(int)(uVar155 - uVar173) * 128.0) / (float)iVar157;
  fVar140 = 0.5;
  if (fVar181 <= 0.0) {
    fVar140 = -0.5;
  }
  uVar150 = (uint)(fVar137 + fVar177);
  uVar165 = (uint)(fVar138 + fVar180);
  uVar145 = (uint)(fVar139 + fVar178);
  uVar156 = (uint)(fVar140 + fVar181);
  uVar151 = uVar151 ^ 0xff;
  fVar177 = ((float)(int)((src_params->shp_params).global_gain_lum_val[5] - uVar155) * 128.0) /
            (float)(uVar151 + (uVar151 == 0));
  fVar137 = 0.5;
  if (fVar177 <= 0.0) {
    fVar137 = -0.5;
  }
  iVar157 = (int)(fVar137 + fVar177);
  if (0x3fe < (int)uVar150) {
    uVar150 = uVar159;
  }
  if ((int)uVar150 < -0x3ff) {
    uVar150 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar165) {
    uVar165 = 0x3ff;
  }
  if ((int)uVar165 < -0x3ff) {
    uVar165 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar145) {
    uVar145 = 0x3ff;
  }
  if ((int)uVar145 < -0x3ff) {
    uVar145 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg137 =
       (anon_struct_4_5_4b644edc_for_reg137)
       ((uVar165 & 0x7ff) << 0x14 | (uint)aVar110 & 0x80080080 | uVar155 | (uVar150 & 0x7ff) << 8);
  if (0x3fe < (int)uVar156) {
    uVar156 = 0x3ff;
  }
  if ((int)uVar156 < -0x3ff) {
    uVar156 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg138 =
       (anon_struct_4_3_c036caa9_for_reg138)
       ((uVar156 & 0x7ff) << 0xc | (uint)(ctx->reg).sharp.reg138 & 0xff800800 | uVar145 & 0x7ff);
  if (0x3fe < iVar157) {
    iVar157 = 0x3ff;
  }
  if (iVar157 < -0x3ff) {
    iVar157 = -0x400;
  }
  *(ushort *)&(ctx->reg).sharp.reg139 =
       SUB42((ctx->reg).sharp.reg139,0) & 0xf800 | (ushort)iVar157 & 0x7ff;
  aVar131._1_3_ = SUB43((ctx->reg).sharp.reg140,1);
  aVar131._0_1_ = (char)(src_params->shp_params).color_ctrl_p0_point_u;
  (ctx->reg).sharp.reg140 = aVar131;
  uVar150 = ((src_params->shp_params).color_ctrl_p0_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg140 =
       (anon_struct_4_5_7839e156_for_reg140)((uint)aVar131 & 0xfff00fff | uVar150);
  (ctx->reg).sharp.reg140 =
       (anon_struct_4_5_7839e156_for_reg140)
       ((uint)aVar131 & 0xf8f00fff | uVar150 |
       ((src_params->shp_params).color_ctrl_p0_scaling_coef & 7U) << 0x18);
  aVar111 = (ctx->reg).sharp.reg141;
  uVar150 = (src_params->shp_params).color_ctrl_p0_roll_tab[0] & 0x1f;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)((uint)aVar111 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p0_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)((uint)aVar111 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p0_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar111 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p0_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar111 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p0_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar111 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar111 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[5] & 0x1fU) << 0x19);
  uVar150 = (src_params->shp_params).color_ctrl_p0_roll_tab[6] & 0x1f;
  aVar112 = (ctx->reg).sharp.reg142;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)((uint)aVar112 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p0_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)((uint)aVar112 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p0_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar112 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p0_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar112 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p0_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar112 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar112 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar150 = (src_params->shp_params).color_ctrl_p0_roll_tab[0xc] & 0x1f;
  aVar113 = (ctx->reg).sharp.reg143;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)((uint)aVar113 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p0_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)((uint)aVar113 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p0_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)
       ((uint)aVar113 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)
       ((uint)aVar113 & 0xfff00000 | uVar150 | uVar151 | uVar145 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar132._1_3_ = SUB43((ctx->reg).sharp.reg144,1);
  aVar132._0_1_ = (char)(src_params->shp_params).color_ctrl_p1_point_u;
  (ctx->reg).sharp.reg144 = aVar132;
  uVar150 = ((src_params->shp_params).color_ctrl_p1_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg144 =
       (anon_struct_4_5_7839e537_for_reg144)((uint)aVar132 & 0xfff00fff | uVar150);
  (ctx->reg).sharp.reg144 =
       (anon_struct_4_5_7839e537_for_reg144)
       ((uint)aVar132 & 0xf8f00fff | uVar150 |
       ((src_params->shp_params).color_ctrl_p1_scaling_coef & 7U) << 0x18);
  uVar150 = (src_params->shp_params).color_ctrl_p1_roll_tab[0] & 0x1f;
  aVar114 = (ctx->reg).sharp.reg145;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)((uint)aVar114 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p1_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)((uint)aVar114 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p1_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar114 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p1_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar114 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p1_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar114 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar114 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[5] & 0x1fU) << 0x19);
  uVar150 = (src_params->shp_params).color_ctrl_p1_roll_tab[6] & 0x1f;
  aVar115 = (ctx->reg).sharp.reg146;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)((uint)aVar115 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p1_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)((uint)aVar115 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p1_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar115 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p1_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar115 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p1_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar115 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar115 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar150 = (src_params->shp_params).color_ctrl_p1_roll_tab[0xc] & 0x1f;
  aVar116 = (ctx->reg).sharp.reg147;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)((uint)aVar116 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p1_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)((uint)aVar116 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p1_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)
       ((uint)aVar116 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)
       ((uint)aVar116 & 0xfff00000 | uVar150 | uVar151 | uVar145 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar133._1_3_ = SUB43((ctx->reg).sharp.reg148,1);
  aVar133._0_1_ = (char)(src_params->shp_params).color_ctrl_p2_point_u;
  (ctx->reg).sharp.reg148 = aVar133;
  uVar150 = ((src_params->shp_params).color_ctrl_p2_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg148 =
       (anon_struct_4_5_7839e918_for_reg148)((uint)aVar133 & 0xfff00fff | uVar150);
  (ctx->reg).sharp.reg148 =
       (anon_struct_4_5_7839e918_for_reg148)
       ((uint)aVar133 & 0xf8f00fff | uVar150 |
       ((src_params->shp_params).color_ctrl_p2_scaling_coef & 7U) << 0x18);
  uVar150 = (src_params->shp_params).color_ctrl_p2_roll_tab[0] & 0x1f;
  aVar117 = (ctx->reg).sharp.reg149;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)((uint)aVar117 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p2_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)((uint)aVar117 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p2_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar117 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p2_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar117 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p2_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar117 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar117 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[5] & 0x1fU) << 0x19);
  uVar150 = (src_params->shp_params).color_ctrl_p2_roll_tab[6] & 0x1f;
  aVar118 = (ctx->reg).sharp.reg150;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)((uint)aVar118 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p2_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)((uint)aVar118 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p2_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar118 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p2_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar118 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p2_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar118 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar118 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar150 = (src_params->shp_params).color_ctrl_p2_roll_tab[0xc] & 0x1f;
  aVar119 = (ctx->reg).sharp.reg151;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)((uint)aVar119 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p2_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)((uint)aVar119 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p2_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)
       ((uint)aVar119 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)
       ((uint)aVar119 & 0xfff00000 | uVar150 | uVar151 | uVar145 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar134._1_3_ = SUB43((ctx->reg).sharp.reg152,1);
  aVar134._0_1_ = (char)(src_params->shp_params).color_ctrl_p3_point_u;
  (ctx->reg).sharp.reg152 = aVar134;
  uVar150 = ((src_params->shp_params).color_ctrl_p3_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg152 =
       (anon_struct_4_5_7839ecf9_for_reg152)((uint)aVar134 & 0xfff00fff | uVar150);
  (ctx->reg).sharp.reg152 =
       (anon_struct_4_5_7839ecf9_for_reg152)
       ((uint)aVar134 & 0xf8f00fff | uVar150 |
       ((src_params->shp_params).color_ctrl_p3_scaling_coef & 7U) << 0x18);
  aVar120 = (ctx->reg).sharp.reg153;
  uVar150 = (src_params->shp_params).color_ctrl_p3_roll_tab[0] & 0x1f;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)((uint)aVar120 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p3_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)((uint)aVar120 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p3_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar120 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p3_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar120 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p3_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar120 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar120 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[5] & 0x1fU) << 0x19);
  aVar121 = (ctx->reg).sharp.reg154;
  uVar150 = (src_params->shp_params).color_ctrl_p3_roll_tab[6] & 0x1f;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)((uint)aVar121 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p3_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)((uint)aVar121 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p3_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar121 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  uVar155 = ((src_params->shp_params).color_ctrl_p3_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar121 & 0xfff00000 | uVar150 | uVar151 | uVar145 | uVar155);
  uVar156 = ((src_params->shp_params).color_ctrl_p3_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar121 & 0xfe000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156);
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar121 & 0xc0000000 | uVar150 | uVar151 | uVar145 | uVar155 | uVar156 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[0xb] & 0x1fU) << 0x19);
  aVar122 = (ctx->reg).sharp.reg155;
  uVar150 = (src_params->shp_params).color_ctrl_p3_roll_tab[0xc] & 0x1f;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)((uint)aVar122 & 0xffffffe0 | uVar150);
  uVar151 = ((src_params->shp_params).color_ctrl_p3_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)((uint)aVar122 & 0xfffffc00 | uVar150 | uVar151);
  uVar145 = ((src_params->shp_params).color_ctrl_p3_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)
       ((uint)aVar122 & 0xffff8000 | uVar150 | uVar151 | uVar145);
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)
       ((uint)aVar122 & 0xfff00000 | uVar150 | uVar151 | uVar145 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar123 = (ctx->reg).sharp.reg156;
  uVar150 = (src_params->shp_params).tex_adj_mode_select & 1;
  (ctx->reg).sharp.reg156 =
       (anon_struct_4_6_adc393a5_for_reg156)((uint)aVar123 & 0xfffffffe | uVar150);
  aVar123 = (anon_struct_4_6_adc393a5_for_reg156)
            (((uint)aVar123 & 0xfffffff8 | uVar150) +
            ((src_params->shp_params).tex_adj_y_mode_select & 3U) * 2);
  (ctx->reg).sharp.reg156 = aVar123;
  uVar150 = (src_params->shp_params).tex_adj_grd[1];
  aVar123 = (anon_struct_4_6_adc393a5_for_reg156)
            (((uint)aVar123 & 0xfffff00f) + (uVar150 & 0x3fc) * 4);
  (ctx->reg).sharp.reg156 = aVar123;
  uVar151 = (src_params->shp_params).tex_adj_grd[2];
  (ctx->reg).sharp.reg156 =
       (anon_struct_4_6_adc393a5_for_reg156)((uint)aVar123 & 0xff00ffff | (uVar151 & 0x3fc) << 0xe);
  uVar169 = (uint)(src_params->shp_params).tex_adj_grd[3] >> 2 & 0xff;
  aVar124 = (ctx->reg).sharp.reg157;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)((uint)aVar124 & 0xffffff00 | uVar169);
  uVar145 = (src_params->shp_params).tex_adj_grd[4];
  uVar155 = (uVar145 & 0x3fc) << 10;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)((uint)aVar124 & 0xfff00f00 | uVar169 | uVar155);
  uVar167 = (src_params->shp_params).tex_adj_val[0] & 0x7f;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)
       ((uint)aVar124 & 0x80f00f00 | uVar169 | uVar155 | uVar167 << 0x18);
  aVar125 = (ctx->reg).sharp.reg158;
  uVar155 = (src_params->shp_params).tex_adj_val[1] & 0x7f;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)((uint)aVar125 & 0xffffff80 | uVar155);
  uVar174 = (src_params->shp_params).tex_adj_val[2] & 0x7f;
  uVar156 = uVar174 << 8;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)((uint)aVar125 & 0xffff8080 | uVar155 | uVar156);
  uVar173 = (src_params->shp_params).tex_adj_val[3] & 0x7f;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)
       ((uint)aVar125 & 0xff808080 | uVar155 | uVar156 | uVar173 << 0x10);
  uVar165 = (src_params->shp_params).tex_adj_val[4] & 0x7f;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)
       ((uint)aVar125 & 0x80808080 | uVar155 | uVar156 | uVar173 << 0x10 | uVar165 << 0x18);
  uVar150 = uVar150 >> 2 & 0xff;
  fVar177 = ((float)(int)(uVar155 - uVar167) * 128.0) / (float)(uVar150 + (uVar150 == 0));
  fVar137 = 0.5;
  if (fVar177 <= 0.0) {
    fVar137 = -0.5;
  }
  uVar151 = uVar151 >> 2 & 0xff;
  iVar157 = uVar151 - uVar150;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar180 = ((float)(int)(uVar174 - uVar155) * 128.0) / (float)iVar157;
  fVar138 = 0.5;
  if (fVar180 <= 0.0) {
    fVar138 = -0.5;
  }
  iVar157 = uVar169 - uVar151;
  if (iVar157 < 2) {
    iVar157 = 1;
  }
  fVar178 = ((float)(int)(uVar173 - uVar174) * 128.0) / (float)iVar157;
  fVar139 = 0.5;
  if (fVar178 <= 0.0) {
    fVar139 = -0.5;
  }
  uVar150 = uVar145 >> 2 & 0xff;
  iVar158 = uVar150 - uVar169;
  iVar157 = 1;
  if (1 < iVar158) {
    iVar157 = iVar158;
  }
  fVar181 = ((float)(int)(uVar165 - uVar173) * 128.0) / (float)iVar157;
  fVar140 = 0.5;
  if (fVar181 <= 0.0) {
    fVar140 = -0.5;
  }
  uVar150 = uVar150 ^ 0xff;
  fVar179 = ((float)(int)((src_params->shp_params).tex_adj_val[5] - uVar165) * 128.0) /
            (float)(uVar150 + (uVar150 == 0));
  if (fVar179 <= 0.0) {
    uVar172 = 0xbfe00000;
  }
  uVar145 = (uint)(fVar140 + fVar181);
  uVar151 = (uint)(fVar138 + fVar180);
  uVar150 = (uint)(fVar177 + fVar137);
  if (0x3fe < (int)uVar150) {
    uVar150 = uVar159;
  }
  if ((int)uVar150 < -0x3ff) {
    uVar150 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar151) {
    uVar151 = 0x3ff;
  }
  if ((int)uVar151 < -0x3ff) {
    uVar151 = 0xfffffc00;
  }
  uVar155 = (uint)(fVar139 + fVar178);
  if (0x3fe < (int)uVar155) {
    uVar155 = 0x3ff;
  }
  if ((int)uVar155 < -0x3ff) {
    uVar155 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg159 =
       (anon_struct_4_3_fedd7f09_for_reg159)
       ((uint)(ctx->reg).sharp.reg159 & 0xff800800 | uVar150 & 0x7ff | (uVar151 & 0x7ff) << 0xc);
  if (0x3fe < (int)uVar145) {
    uVar145 = 0x3ff;
  }
  if ((int)uVar145 < -0x3ff) {
    uVar145 = 0xfffffc00;
  }
  uVar150 = (uint)((double)((ulong)uVar172 << 0x20) + (double)fVar179);
  if ((int)uVar150 < 0x3ff) {
    uVar159 = uVar150;
  }
  (ctx->reg).sharp.reg160 =
       (anon_struct_4_3_fedd8709_for_reg160)
       ((uint)(ctx->reg).sharp.reg160 & 0xff800800 | uVar155 & 0x7ff | (uVar145 & 0x7ff) << 0xc);
  if ((int)uVar159 < -0x3ff) {
    uVar159 = 0xfffffc00;
  }
  *(ushort *)&(ctx->reg).sharp.reg161 =
       SUB42((ctx->reg).sharp.reg161,0) & 0xf800 | (ushort)uVar159 & 0x7ff;
  RVar171 = src_params->dst_fmt;
  (src_params->zme_params).src_width = src_params->src_width;
  (src_params->zme_params).src_height = src_params->src_height;
  (src_params->zme_params).dst_width = src_params->dst_width;
  (src_params->zme_params).dst_height = src_params->dst_height;
  (src_params->zme_params).dst_fmt = RVar171;
  (src_params->zme_params).yuv_out_diff = src_params->yuv_out_diff;
  (src_params->zme_params).dst_c_width = src_params->dst_c_width;
  (src_params->zme_params).dst_c_height = src_params->dst_c_height;
  set_zme_to_vdpp_reg(&src_params->zme_params,&ctx->zme);
  return extraout_EAX;
}

Assistant:

static MPP_RET vdpp2_params_to_reg(struct vdpp2_params* src_params, struct vdpp2_api_ctx *ctx)
{
    struct vdpp2_reg *dst_reg = &ctx->reg;
    struct zme_params *zme_params = &src_params->zme_params;

    memset(dst_reg, 0, sizeof(*dst_reg));

    dst_reg->common.reg0.sw_vdpp_frm_en = 1;

    /* 0x0004(reg1), TODO: add debug function */
    dst_reg->common.reg1.sw_vdpp_src_fmt = VDPP_FMT_YUV420;
    dst_reg->common.reg1.sw_vdpp_src_yuv_swap = src_params->src_yuv_swap;

    if (MPP_FMT_YUV420SP_VU == src_params->src_fmt)
        dst_reg->common.reg1.sw_vdpp_src_yuv_swap = 1;

    dst_reg->common.reg1.sw_vdpp_dst_fmt = src_params->dst_fmt;
    dst_reg->common.reg1.sw_vdpp_dst_yuv_swap = src_params->dst_yuv_swap;
    dst_reg->common.reg1.sw_vdpp_dbmsr_en = (src_params->working_mode == VDPP_WORK_MODE_DCI)
                                            ? 0
                                            : src_params->dmsr_params.dmsr_enable;

    /* 0x0008(reg2) */
    dst_reg->common.reg2.sw_vdpp_working_mode = src_params->working_mode;
    VDPP2_DBG(VDPP2_DBG_TRACE, "working_mode %d", src_params->working_mode);

    /* 0x000C ~ 0x001C(reg3 ~ reg7), skip */
    dst_reg->common.reg4.sw_vdpp_clk_on = 1;
    dst_reg->common.reg4.sw_md_clk_on = 1;
    dst_reg->common.reg4.sw_dect_clk_on = 1;
    dst_reg->common.reg4.sw_me_clk_on = 1;
    dst_reg->common.reg4.sw_mc_clk_on = 1;
    dst_reg->common.reg4.sw_eedi_clk_on = 1;
    dst_reg->common.reg4.sw_ble_clk_on = 1;
    dst_reg->common.reg4.sw_out_clk_on = 1;
    dst_reg->common.reg4.sw_ctrl_clk_on = 1;
    dst_reg->common.reg4.sw_ram_clk_on = 1;
    dst_reg->common.reg4.sw_dma_clk_on = 1;
    dst_reg->common.reg4.sw_reg_clk_on = 1;

    /* 0x0020(reg8) */
    dst_reg->common.reg8.sw_vdpp_frm_done_en = 1;
    dst_reg->common.reg8.sw_vdpp_osd_max_en = 1;
    dst_reg->common.reg8.sw_vdpp_bus_error_en = 1;
    dst_reg->common.reg8.sw_vdpp_timeout_int_en = 1;
    dst_reg->common.reg8.sw_vdpp_config_error_en = 1;
    /* 0x0024 ~ 0x002C(reg9 ~ reg11), skip */
    {
        RK_U32 src_right_redundant = src_params->src_width % 16 == 0 ? 0 : 16 - src_params->src_width % 16;
        RK_U32 src_down_redundant  = src_params->src_height % 8 == 0 ? 0 : 8 - src_params->src_height % 8;
        RK_U32 dst_right_redundant = src_params->dst_width % 16 == 0 ? 0 : 16 - src_params->dst_width % 16;
        /* 0x0030(reg12) */
        dst_reg->common.reg12.sw_vdpp_src_vir_y_stride = src_params->src_width_vir / 4;

        /* 0x0034(reg13) */
        dst_reg->common.reg13.sw_vdpp_dst_vir_y_stride = src_params->dst_width_vir / 4;

        /* 0x0038(reg14) */
        dst_reg->common.reg14.sw_vdpp_src_pic_width = src_params->src_width + src_right_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_right_redundant = src_right_redundant;
        dst_reg->common.reg14.sw_vdpp_src_pic_height = src_params->src_height + src_down_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_down_redundant = src_down_redundant;

        /* 0x003C(reg15) */
        dst_reg->common.reg15.sw_vdpp_dst_pic_width = src_params->dst_width + dst_right_redundant - 1;
        dst_reg->common.reg15.sw_vdpp_dst_right_redundant = dst_right_redundant;
        dst_reg->common.reg15.sw_vdpp_dst_pic_height = src_params->dst_height - 1;
    }
    /* 0x0040 ~ 0x005C(reg16 ~ reg23), skip */
    dst_reg->common.reg20.sw_vdpp_timeout_en = 1;
    dst_reg->common.reg20.sw_vdpp_timeout_cnt = 0x8FFFFFF;

    /* 0x0060(reg24) */
    dst_reg->common.reg24.sw_vdpp_src_addr_y = src_params->src.y;

    /* 0x0064(reg25) */
    dst_reg->common.reg25.sw_vdpp_src_addr_uv = src_params->src.cbcr;

    /* 0x0068(reg26) */
    dst_reg->common.reg26.sw_vdpp_dst_addr_y = src_params->dst.y;

    /* 0x006C(reg27) */
    dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst.cbcr;

    if (src_params->yuv_out_diff) {
        RK_U32 dst_right_redundant_c = src_params->dst_c_width % 16 == 0 ? 0 : 16 - src_params->dst_c_width % 16;

        dst_reg->common.reg1.sw_vdpp_yuvout_diff_en = src_params->yuv_out_diff;
        dst_reg->common.reg13.sw_vdpp_dst_vir_c_stride = src_params->dst_c_width_vir / 4;
        /* 0x0040(reg16) */
        dst_reg->common.reg16.sw_vdpp_dst_pic_width_c = src_params->dst_c_width + dst_right_redundant_c - 1;
        dst_reg->common.reg16.sw_vdpp_dst_right_redundant_c = dst_right_redundant_c;
        dst_reg->common.reg16.sw_vdpp_dst_pic_height_c = src_params->dst_c_height - 1;

        dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst_c.cbcr;
    }

    set_dmsr_to_vdpp_reg(&src_params->dmsr_params, &ctx->dmsr);
    set_hist_to_vdpp2_reg(src_params, dst_reg);
    set_es_to_vdpp2_reg(src_params, dst_reg);
    set_shp_to_vdpp2_reg(src_params, dst_reg);

    zme_params->src_width = src_params->src_width;
    zme_params->src_height = src_params->src_height;
    zme_params->dst_width = src_params->dst_width;
    zme_params->dst_height = src_params->dst_height;
    zme_params->dst_fmt = src_params->dst_fmt;
    zme_params->yuv_out_diff = src_params->yuv_out_diff;
    zme_params->dst_c_width = src_params->dst_c_width;
    zme_params->dst_c_height = src_params->dst_c_height;
    set_zme_to_vdpp_reg(zme_params, &ctx->zme);

    return MPP_OK;
}